

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_psbt.cpp
# Opt level: O0

void __thiscall Psbt_UsecaseTest2_Test::TestBody(Psbt_UsecaseTest2_Test *this)

{
  __normal_iterator<cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
  __first;
  ulong uVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  char *pcVar5;
  size_type sVar6;
  Txid *pTVar7;
  reference pvVar8;
  reference pvVar9;
  reference pvVar10;
  undefined1 extraout_DL;
  CoinSelectionOption *expected_predicate_value;
  AssertionResult gtest_ar_48;
  CfdException *except_11;
  AssertionResult gtest_ar_47;
  ByteData256 sighash;
  UtxoData utxo5;
  UtxoData utxo4;
  UtxoData utxo0;
  AssertionResult gtest_ar_46;
  AssertionResult gtest_ar_45;
  AssertionResult gtest_ar_44;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  TransactionContext context;
  AssertionResult gtest_ar_43;
  Transaction tx;
  AssertionResult gtest_ar_42;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar_41;
  CfdException *except_10;
  AssertionResult gtest_ar_40;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  OutPoint outpoint1;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_39;
  CfdException *except_9;
  AssertionResult gtest_ar_38;
  AssertionResult gtest_ar_37;
  AssertionResult gtest_ar_36;
  CfdException *except_8;
  AssertionResult gtest_ar_35;
  CfdException *except_7;
  Privkey *privkey;
  iterator __end1_1;
  iterator __begin1_1;
  vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> *__range1_1;
  AssertionResult gtest_ar_34;
  CfdException *except_6;
  AssertionResult gtest_ar_33;
  size_t index_2;
  UtxoData *select_utxo;
  iterator __end1;
  iterator __begin1;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *__range1;
  uint32_t index_1;
  AssertionResult gtest_ar_32;
  AssertionResult gtest_ar_31;
  AssertionResult gtest_ar_30;
  AssertionResult gtest_ar_29;
  AssertionResult gtest_ar_28;
  AssertionResult gtest_ar_27;
  AssertionResult gtest_ar_26;
  AssertionResult gtest_ar_25;
  AssertionResult gtest_ar_24;
  AssertionResult gtest_ar_23;
  AssertionResult gtest_ar_22;
  AssertionResult gtest_ar_21;
  AssertionResult gtest_ar_20;
  AssertionResult gtest_ar_19;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  CoinSelectionOption option;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> selection_utxo;
  Amount fee;
  vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> target_privkey_list1;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> selected_utxos;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  CfdException *except_5;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  CfdException *except_4;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  CfdException *except_3;
  AssertionResult gtest_ar_3;
  CfdException *except_2;
  uint32_t index;
  uint32_t use_utxo1_count;
  Psbt psbt2;
  Psbt psbt1;
  AssertionResult gtest_ar_2;
  CfdException *except_1;
  AssertionResult gtest_ar_1;
  CfdException *except;
  Amount amount;
  Address out_addr2;
  Address out_addr1;
  KeyData out_key2;
  KeyData out_key1;
  string out_path2;
  string out_path1;
  Psbt psbt;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxo_list2;
  vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> privkey_list2;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxo_list1;
  vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> privkey_list1;
  AssertionResult gtest_ar;
  Descriptor change_desc1;
  string change_descriptor1;
  KeyData change_key1;
  string path1;
  HDWallet wallet2;
  HDWallet wallet1;
  NetType net_type;
  undefined8 in_stack_ffffffffffffb9f8;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *pvVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffba00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rhs;
  KeyData *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffba08;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_ffffffffffffba10;
  back_insert_iterator<std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
  in_stack_ffffffffffffba18;
  __normal_iterator<cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
  in_stack_ffffffffffffba20;
  undefined4 in_stack_ffffffffffffba28;
  undefined4 in_stack_ffffffffffffba2c;
  undefined4 uVar12;
  AssertHelper local_4150;
  Message local_4148;
  string local_4140 [32];
  AssertionResult local_4120;
  SigHashType local_4110 [15];
  allocator local_4101;
  string local_4100 [32];
  ByteData local_40e0;
  undefined1 local_40c8 [24];
  UtxoData local_40b0 [1264];
  UtxoData local_3bc0 [1100];
  uint32_t in_stack_ffffffffffffc88c;
  Amount *in_stack_ffffffffffffc890;
  string *in_stack_ffffffffffffc898;
  HDWallet *in_stack_ffffffffffffc8a0;
  NetType in_stack_ffffffffffffc8ac;
  uint32_t in_stack_ffffffffffffc8c0;
  vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> *in_stack_ffffffffffffc8c8;
  UtxoData local_36d0 [1264];
  AssertHelper local_31e0;
  Message local_31d8;
  string local_31d0 [32];
  AssertionResult local_31b0;
  AssertHelper local_31a0;
  Message local_3198;
  undefined8 local_3190;
  undefined4 local_3184;
  AssertionResult local_3180;
  AssertHelper local_3170;
  Message local_3168;
  undefined8 local_3160;
  undefined4 local_3154;
  AssertionResult local_3150;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_3140;
  string local_3128 [32];
  TransactionContext local_3108 [184];
  AssertHelper local_3050;
  Message local_3048;
  string local_3040 [32];
  AssertionResult local_3020 [5];
  AssertHelper local_2fd0;
  Message local_2fc8;
  undefined4 local_2fbc;
  undefined8 local_2fb8;
  undefined1 local_2fb0;
  undefined8 local_2fa8;
  undefined1 local_2fa0;
  undefined8 local_2f98;
  AssertionResult local_2f90;
  string local_2f80;
  AssertHelper local_2f60;
  Message local_2f58;
  byte local_2f49;
  AssertionResult local_2f48 [3];
  AssertHelper local_2f10;
  Message local_2f08 [4];
  string local_2ee8 [32];
  AssertionResult local_2ec8;
  string local_2eb8;
  AssertHelper local_2e98;
  Message local_2e90;
  byte local_2e81;
  AssertionResult local_2e80;
  string local_2e70;
  AssertHelper local_2e50;
  Message local_2e48;
  byte local_2e39;
  AssertionResult local_2e38;
  OutPoint local_2e28;
  string local_2e00;
  AssertHelper local_2de0;
  Message local_2dd8;
  byte local_2dc9;
  AssertionResult local_2dc8 [3];
  AssertHelper local_2d90;
  Message local_2d88;
  string local_2d80 [32];
  AssertionResult local_2d60;
  AssertHelper local_2d50;
  Message local_2d48 [4];
  string local_2d28 [32];
  AssertionResult local_2d08 [6];
  reference local_2ca8;
  Privkey *local_2ca0;
  __normal_iterator<cfd::core::Privkey_*,_std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>_>
  local_2c98;
  vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> *local_2c90;
  AssertHelper local_2c60;
  Message local_2c58;
  string local_2c50 [32];
  AssertionResult local_2c30;
  ulong local_2c20;
  reference local_2c18;
  UtxoData *local_2c10;
  __normal_iterator<cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
  local_2c08;
  undefined1 *local_2c00;
  uint local_2bf4;
  AssertHelper local_2bf0;
  Message local_2be8;
  undefined4 local_2bdc;
  undefined8 local_2bd8;
  AssertionResult local_2bd0;
  vector local_2bc0 [24];
  AssertHelper local_2ba8;
  Message local_2ba0;
  AssertionResult local_2b98;
  AssertHelper local_2b88;
  Message local_2b80;
  undefined4 local_2b74;
  AssertionResult local_2b70;
  AssertHelper local_2b60;
  Message local_2b58;
  string local_2b50 [32];
  AssertionResult local_2b30;
  AssertHelper local_2b20;
  Message local_2b18;
  AssertionResult local_2b10;
  AssertHelper local_2b00;
  Message local_2af8;
  undefined4 local_2aec;
  AssertionResult local_2ae8;
  AssertHelper local_2ad8;
  Message local_2ad0;
  string local_2ac8 [32];
  AssertionResult local_2aa8;
  AssertHelper local_2a98;
  Message local_2a90;
  AssertionResult local_2a88;
  AssertHelper local_2a78;
  Message local_2a70;
  undefined4 local_2a64;
  AssertionResult local_2a60;
  AssertHelper local_2a50;
  Message local_2a48;
  string local_2a40 [32];
  AssertionResult local_2a20;
  AssertHelper local_2a10;
  Message local_2a08;
  AssertionResult local_2a00;
  AssertHelper local_29f0;
  Message local_29e8;
  undefined4 local_29dc;
  AssertionResult local_29d8;
  AssertHelper local_29c8;
  Message local_29c0;
  string local_29b8 [32];
  AssertionResult local_2998;
  AssertHelper local_2988;
  Message local_2980;
  AssertionResult local_2978;
  AssertHelper local_2968;
  Message local_2960;
  undefined4 local_2954;
  AssertionResult local_2950;
  AssertHelper local_2940;
  Message local_2938;
  string local_2930 [32];
  AssertionResult local_2910;
  AssertHelper local_2900;
  Message local_28f8;
  undefined4 local_28f0;
  undefined4 local_28ec;
  AssertionResult local_28e8;
  AssertHelper local_28d8;
  Message local_28d0;
  undefined8 local_28c8;
  undefined4 local_28bc;
  AssertionResult local_28b8;
  AssertHelper local_28a8;
  Message local_28a0;
  size_type local_2898;
  undefined4 local_288c;
  AssertionResult local_2888;
  CoinSelectionOption local_2878 [104];
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *local_2810;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *local_2808;
  UtxoData *local_2800;
  UtxoData *local_27f8;
  UtxoData *local_27f0;
  UtxoData *local_27e8;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_27e0;
  UtxoFilter local_27c8 [10];
  undefined1 local_27a0 [24];
  AssertHelper local_2788;
  Message local_2780;
  string local_2778 [32];
  AssertionResult local_2758 [3];
  AssertHelper local_2720;
  Message local_2718;
  undefined1 local_2710 [1264];
  string local_2220 [32];
  string local_2200 [32];
  AssertionResult local_21e0;
  AssertHelper local_21d0;
  Message local_21c8;
  undefined1 local_21c0 [1264];
  undefined8 local_1cd0;
  undefined8 local_1cc8;
  AssertionResult local_1cc0;
  AssertHelper local_1cb0;
  Message local_1ca8;
  undefined1 local_1ca0 [1264];
  undefined8 local_17b0;
  undefined4 local_17a4;
  AssertionResult local_17a0 [3];
  AssertHelper local_1768;
  Message local_1760;
  undefined1 local_1758 [1264];
  undefined8 local_1268;
  undefined4 local_125c;
  AssertionResult local_1258;
  AssertHelper local_1248;
  Message local_1240;
  undefined1 local_1238 [1264];
  undefined8 local_d48;
  undefined4 local_d3c;
  AssertionResult local_d38;
  AssertHelper local_d28;
  Message local_d20;
  undefined4 local_d18;
  undefined4 local_d14;
  AssertionResult local_d10 [6];
  uint local_cb0;
  uint local_cac;
  Psbt local_ca8;
  Psbt local_c28;
  Amount local_b58 [16];
  Pubkey local_b48;
  KeyData local_b30;
  Pubkey local_9b8;
  KeyData local_9a0;
  undefined1 local_828 [336];
  undefined1 local_6d8 [343];
  allocator local_581;
  string local_580 [39];
  allocator local_559;
  string local_558 [32];
  Psbt local_538;
  Amount local_4b8 [23];
  allocator local_4a1;
  string local_4a0 [32];
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_480;
  undefined1 local_468 [47];
  allocator local_439;
  string local_438 [32];
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_418;
  vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> local_400;
  AssertHelper local_3e8;
  Message local_3e0;
  AssertionResult local_3d8;
  string local_3c8 [360];
  string local_260 [32];
  string local_240 [32];
  vector local_220 [32];
  undefined1 local_200 [343];
  allocator local_a9;
  string local_a8 [32];
  ByteData local_88;
  HDWallet local_70 [24];
  ByteData local_58;
  HDWallet local_40 [28];
  undefined4 local_24;
  allocator local_1d [20];
  allocator local_9 [9];
  
  uVar12 = (undefined4)((ulong)in_stack_ffffffffffffb9f8 >> 0x20);
  if ((TestBody()::seed1_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&TestBody()::seed1_abi_cxx11_), iVar4 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&TestBody()::seed1_abi_cxx11_,
               "8bc106907003ea0b55f3ed4ce2fcf9a198d8c43f07e6ade8aacc5c20c33db12e",local_9);
    std::allocator<char>::~allocator((allocator<char> *)local_9);
    __cxa_atexit(std::__cxx11::string::~string,&TestBody()::seed1_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&TestBody()::seed1_abi_cxx11_);
  }
  if ((TestBody()::seed2_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&TestBody()::seed2_abi_cxx11_), iVar4 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&TestBody()::seed2_abi_cxx11_,
               "d3e3539eafb6af1f0ae374ecffd33bed394f5eb2e39f8957be63c258ac32ca97",local_1d);
    std::allocator<char>::~allocator((allocator<char> *)local_1d);
    __cxa_atexit(std::__cxx11::string::~string,&TestBody()::seed2_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&TestBody()::seed2_abi_cxx11_);
  }
  local_24 = 2;
  cfd::core::ByteData::ByteData(&local_58,(string *)&g_psbt_seed1_abi_cxx11_);
  cfd::core::HDWallet::HDWallet(local_40,&local_58);
  cfd::core::ByteData::~ByteData((ByteData *)0x245f88);
  cfd::core::ByteData::ByteData(&local_88,(string *)&g_psbt_seed2_abi_cxx11_);
  cfd::core::HDWallet::HDWallet(local_70,&local_88);
  cfd::core::ByteData::~ByteData((ByteData *)0x245fc2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"44h/0h/0h/1/100",&local_a9);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  cfd::core::HDWallet::GeneratePubkeyData((NetType)local_200,(string *)local_40);
  cfd::core::KeyData::ToString_abi_cxx11_(SUB81(local_260,0),(HardenedType)local_200,true);
  std::operator+((char *)in_stack_ffffffffffffba08,in_stack_ffffffffffffba00);
  std::operator+(in_stack_ffffffffffffba08,(char *)in_stack_ffffffffffffba00);
  std::__cxx11::string::~string(local_240);
  std::__cxx11::string::~string(local_260);
  cfd::core::Descriptor::Parse(local_3c8,local_220);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_3d8,
             "\"wpkh([2a704760/44\'/0\'/0\'/1/100]02f7f0d7d00289b7c5a581bc35276040c348de48fc414067f31ea26ad95c00550c)\""
             ,"change_descriptor1.c_str()",
             "wpkh([2a704760/44\'/0\'/0\'/1/100]02f7f0d7d00289b7c5a581bc35276040c348de48fc414067f31ea26ad95c00550c)"
             ,pcVar5);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_3d8);
  if (!bVar2) {
    testing::Message::Message(&local_3e0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x2462eb);
    testing::internal::AssertHelper::AssertHelper
              (&local_3e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0xc0,pcVar5);
    testing::internal::AssertHelper::operator=(&local_3e8,&local_3e0);
    testing::internal::AssertHelper::~AssertHelper(&local_3e8);
    testing::Message::~Message((Message *)0x24634e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2463a6);
  std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>::vector
            ((vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> *)0x2463b3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_438,"44h/0h/0h/1",&local_439);
  cfd::core::Amount::Amount((Amount *)(local_468 + 0x18),10000000);
  CfdTestGenerateUtxo(in_stack_ffffffffffffc8ac,in_stack_ffffffffffffc8a0,in_stack_ffffffffffffc898,
                      in_stack_ffffffffffffc890,in_stack_ffffffffffffc88c,in_stack_ffffffffffffc8c0,
                      in_stack_ffffffffffffc8c8);
  std::__cxx11::string::~string(local_438);
  std::allocator<char>::~allocator((allocator<char> *)&local_439);
  std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>::vector
            ((vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> *)0x246478);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4a0,"44h/0h/0h/1",&local_4a1);
  cfd::core::Amount::Amount(local_4b8,50000000);
  rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_468;
  pvVar11 = (vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)CONCAT44(uVar12,3);
  CfdTestGenerateUtxo(in_stack_ffffffffffffc8ac,in_stack_ffffffffffffc8a0,in_stack_ffffffffffffc898,
                      in_stack_ffffffffffffc890,in_stack_ffffffffffffc88c,in_stack_ffffffffffffc8c0,
                      in_stack_ffffffffffffc8c8);
  std::__cxx11::string::~string(local_4a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
  cfd::Psbt::Psbt(&local_538);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_558,"44h/0h/0h/0/2",&local_559);
  std::allocator<char>::~allocator((allocator<char> *)&local_559);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_580,"44h/0h/0h/0/2",&local_581);
  std::allocator<char>::~allocator((allocator<char> *)&local_581);
  cfd::core::HDWallet::GeneratePubkeyData((NetType)local_6d8,(string *)local_40);
  cfd::core::HDWallet::GeneratePubkeyData((NetType)local_828,(string *)local_70);
  cfd::core::KeyData::GetPubkey();
  cfd::core::Address::Address((Address *)&local_9a0,kTestnet,kVersion0,&local_9b8);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x24664d);
  cfd::core::KeyData::GetPubkey();
  cfd::core::Address::Address((Address *)&local_b30,kTestnet,kVersion0,&local_b48);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x24668f);
  cfd::core::Amount::Amount(local_b58,50000000);
  cfd::Psbt::AddTxOutData((Amount *)&local_538,(Address *)local_b58,&local_9a0);
  cfd::Psbt::AddTxOutData((Amount *)&local_538,(Address *)local_b58,&local_b30);
  cfd::Psbt::Psbt(&local_c28);
  cfd::Psbt::Psbt(&local_ca8);
  local_cac = 5;
  cfd::Psbt::operator=(&local_c28,&local_538);
  for (local_cb0 = 0; local_cb0 < local_cac; local_cb0 = local_cb0 + 1) {
    std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[]
              (&local_418,(ulong)local_cb0);
    cfd::Psbt::AddTxInData((UtxoData *)&local_c28);
  }
  cfd::Psbt::operator=(&local_ca8,&local_538);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[](&local_480,0);
  cfd::Psbt::AddTxInData((UtxoData *)&local_ca8);
  cfd::core::Psbt::Join(&local_538.super_Psbt,SUB81(&local_c28,0));
  local_d14 = 5;
  local_d18 = cfd::core::Psbt::GetTxInCount();
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((char *)in_stack_ffffffffffffba18.container,(char *)in_stack_ffffffffffffba10,
             (int *)in_stack_ffffffffffffba08,(uint *)rhs);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_d10);
  if (!bVar2) {
    testing::Message::Message(&local_d20);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x24728a);
    testing::internal::AssertHelper::AssertHelper
              (&local_d28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0xf8,pcVar5);
    testing::internal::AssertHelper::operator=(&local_d28,&local_d20);
    testing::internal::AssertHelper::~AssertHelper(&local_d28);
    testing::Message::~Message((Message *)0x2472ed);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x247345);
  local_d3c = 10000000;
  cfd::Psbt::GetUtxoData((uint)local_1238,(NetType)&local_538);
  local_d48 = cfd::core::Amount::GetSatoshiValue();
  testing::internal::EqHelper<false>::Compare<int,long>
            ((char *)in_stack_ffffffffffffba18.container,(char *)in_stack_ffffffffffffba10,
             (int *)in_stack_ffffffffffffba08,(long *)rhs);
  cfd::UtxoData::~UtxoData((UtxoData *)rhs);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_d38);
  if (!bVar2) {
    testing::Message::Message(&local_1240);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x247461);
    testing::internal::AssertHelper::AssertHelper
              (&local_1248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0xf9,pcVar5);
    testing::internal::AssertHelper::operator=(&local_1248,&local_1240);
    testing::internal::AssertHelper::~AssertHelper(&local_1248);
    testing::Message::~Message((Message *)0x2474c4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x24751c);
  local_125c = 10000000;
  cfd::Psbt::GetUtxoData((uint)local_1758,(NetType)&local_538);
  local_1268 = cfd::core::Amount::GetSatoshiValue();
  testing::internal::EqHelper<false>::Compare<int,long>
            ((char *)in_stack_ffffffffffffba18.container,(char *)in_stack_ffffffffffffba10,
             (int *)in_stack_ffffffffffffba08,(long *)rhs);
  cfd::UtxoData::~UtxoData((UtxoData *)rhs);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_1258);
  if (!bVar2) {
    testing::Message::Message(&local_1760);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x24763b);
    testing::internal::AssertHelper::AssertHelper
              (&local_1768,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0xfa,pcVar5);
    testing::internal::AssertHelper::operator=(&local_1768,&local_1760);
    testing::internal::AssertHelper::~AssertHelper(&local_1768);
    testing::Message::~Message((Message *)0x24769e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2476f3);
  cfd::core::Psbt::Join(&local_538.super_Psbt,SUB81(&local_ca8,0));
  local_17a4 = 50000000;
  cfd::Psbt::GetUtxoData((uint)local_1ca0,(NetType)&local_538);
  local_17b0 = cfd::core::Amount::GetSatoshiValue();
  testing::internal::EqHelper<false>::Compare<int,long>
            ((char *)in_stack_ffffffffffffba18.container,(char *)in_stack_ffffffffffffba10,
             (int *)in_stack_ffffffffffffba08,(long *)rhs);
  cfd::UtxoData::~UtxoData((UtxoData *)rhs);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_17a0);
  if (!bVar2) {
    testing::Message::Message(&local_1ca8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x247a56);
    testing::internal::AssertHelper::AssertHelper
              (&local_1cb0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x101,pcVar5);
    testing::internal::AssertHelper::operator=(&local_1cb0,&local_1ca8);
    testing::internal::AssertHelper::~AssertHelper(&local_1cb0);
    testing::Message::~Message((Message *)0x247ab9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x247b11);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[](&local_480,0);
  local_1cc8 = cfd::core::Amount::GetSatoshiValue();
  cfd::Psbt::GetUtxoData((uint)local_21c0,(NetType)&local_538);
  local_1cd0 = cfd::core::Amount::GetSatoshiValue();
  testing::internal::EqHelper<false>::Compare<long,long>
            ((char *)in_stack_ffffffffffffba18.container,(char *)in_stack_ffffffffffffba10,
             (long *)in_stack_ffffffffffffba08,(long *)rhs);
  cfd::UtxoData::~UtxoData((UtxoData *)rhs);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_1cc0);
  if (!bVar2) {
    testing::Message::Message(&local_21c8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x247c5f);
    testing::internal::AssertHelper::AssertHelper
              (&local_21d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x102,pcVar5);
    testing::internal::AssertHelper::operator=(&local_21d0,&local_21c8);
    testing::internal::AssertHelper::~AssertHelper(&local_21d0);
    testing::Message::~Message((Message *)0x247cc2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x247d1a);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[](&local_480,0);
  cfd::core::Txid::GetHex_abi_cxx11_();
  cfd::Psbt::GetUtxoData((uint)local_2710,(NetType)&local_538);
  cfd::core::Txid::GetHex_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((char *)in_stack_ffffffffffffba18.container,(char *)in_stack_ffffffffffffba10,
             in_stack_ffffffffffffba08,rhs);
  std::__cxx11::string::~string(local_2220);
  cfd::UtxoData::~UtxoData((UtxoData *)rhs);
  std::__cxx11::string::~string(local_2200);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_21e0);
  if (!bVar2) {
    testing::Message::Message(&local_2718);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x247ea8);
    testing::internal::AssertHelper::AssertHelper
              (&local_2720,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x103,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2720,&local_2718);
    testing::internal::AssertHelper::~AssertHelper(&local_2720);
    testing::Message::~Message((Message *)0x247f0b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x247f60);
  cfd::core::Psbt::GetBase64_abi_cxx11_();
  pcVar5 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_2758,
             "\"cHNidP8BAP0+AQIAAAAG+DTafLXhg/yBX3hGInKEZg+koKWDviv7SlNb9CXlMd4BAAAAAP////9a72o7znYklRrluejAkI6P90ch7t96CZTVvx78fe6CgQIAAAAA/////6kt1klSeJ79FESTjpzlsQbnKACJxNxKeLPafHoradk/AwAAAAD//////Pcse7iIGUWVXkj1TmCBtRkBg2SE5cSKmSUGECnEBdEEAAAAAP////+gvhpNmiLIMtLSCjoITwENCamrQfs+Le29RusBBFePuQUAAAAA/////3GhQb9bZT4sQ3czBdaajJh2lERwyh4p5LA6CVPEvraVAQAAAAD/////AoDw+gIAAAAAFgAUsyK93OYzuFGsc3CrRU8LNnoGVOWA8PoCAAAAABYAFMq4xTpuj8ApbRzTkVowfVHEkaVVAAAAAAABAR+AlpgAAAAAABYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgYCVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv4YKnBHYCwAAIAAAACAAAAAgAEAAAABAAAAAAEBH4CWmAAAAAAAFgAUi/CdYLfjTzSCfY28scdjkKkWyoIiBgInRM+yQ24VYEDsHI/oQtnvmhjLQK1B8xJyU5DDX3vTaxgqcEdgLAAAgAAAAIAAAACAAQAAAAIAAAAAAQEfgJaYAAAAAAAWABTx0+5ngpIl64ksyrAeIvand+fiHiIGAufo3CNvoCQ2lAjSzk2FCASCYavCl7gRYE2gh61x0ThVGCpwR2AsAACAAAAAgAAAAIABAAAAAwAAAAABAR+AlpgAAAAAABYAFBnWX4MosiBtmXB4VmDsDTSAj7B1IgYDPYdL8ZtpfPbGOWWVR6WDuGcwFkpbbbAb8goU65tq20QYKnBHYCwAAIAAAACAAAAAgAEAAAAEAAAAAAEBH4CWmAAAAAAAFgAUEreVSnXvwqIOhuMtwteGR9ZwB3kiBgL7Bhcw2948gGtKF6mfRUyBKCrs7m1G9Kl1qUzf06BlBBgqcEdgLAAAgAAAAIAAAACAAQAAAAUAAAAAAQEfgPD6AgAAAAAWABSXipBGDkRnGlL0mgm7WcxnlLY8iSIGA+PSRKOWfguHdl/ahsX/OIhfdJk5U7lYQ4iu8wsmr2rsGJ1rbYYsAACAAAAAgAAAAIABAAAAAQAAAAAiAgNHO/yMdwwbIgoueq5LrfbA1+rykCjVsp00OAErsonvgRgqcEdgLAAAgAAAAIAAAACAAAAAAAIAAAAAIgIDZHSv8mM8NRhlU5+1K2K51vueTiNXZijh8KCnmTRY4GwYnWtthiwAAIAAAACAAAAAgAAAAAACAAAAAA==\""
             ,"psbt.GetBase64().c_str()",
             "cHNidP8BAP0+AQIAAAAG+DTafLXhg/yBX3hGInKEZg+koKWDviv7SlNb9CXlMd4BAAAAAP////9a72o7znYklRrluejAkI6P90ch7t96CZTVvx78fe6CgQIAAAAA/////6kt1klSeJ79FESTjpzlsQbnKACJxNxKeLPafHoradk/AwAAAAD//////Pcse7iIGUWVXkj1TmCBtRkBg2SE5cSKmSUGECnEBdEEAAAAAP////+gvhpNmiLIMtLSCjoITwENCamrQfs+Le29RusBBFePuQUAAAAA/////3GhQb9bZT4sQ3czBdaajJh2lERwyh4p5LA6CVPEvraVAQAAAAD/////AoDw+gIAAAAAFgAUsyK93OYzuFGsc3CrRU8LNnoGVOWA8PoCAAAAABYAFMq4xTpuj8ApbRzTkVowfVHEkaVVAAAAAAABAR+AlpgAAAAAABYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgYCVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv4YKnBHYCwAAIAAAACAAAAAgAEAAAABAAAAAAEBH4CWmAAAAAAAFgAUi/CdYLfjTzSCfY28scdjkKkWyoIiBgInRM+yQ24VYEDsHI/oQtnvmhjLQK1B8xJyU5DDX3vTaxgqcEdgLAAAgAAAAIAAAACAAQAAAAIAAAAAAQEfgJaYAAAAAAAWABTx0+5ngpIl64ksyrAeIvand+fiHiIGAufo3CNvoCQ2lAjSzk2FCASCYavCl7gRYE2gh61x0ThVGCpwR2AsAACAAAAAgAAAAIABAAAAAwAAAAABAR+AlpgAAAAAABYAFBnWX4MosiBtmXB4VmDsDTSAj7B1IgYDPYdL8ZtpfPbGOWWVR6WDuGcwFkpbbbAb8goU65tq20QYKnBHYCwAAIAAAACAAAAAgAEAAAAEAAAAAAEBH4CWmAAAAAAAFgAUEreVSnXvwqIOhuMtwteGR9ZwB3kiBgL7Bhcw2948gGtKF6mfRUyBKCrs7m1G9Kl1qUzf06BlBBgqcEdgLAAAgAAAAIAAAACAAQAAAAUAAAAAAQEfgPD6AgAAAAAWABSXipBGDkRnGlL0mgm7WcxnlLY8iSIGA+PSRKOWfguHdl/ahsX/OIhfdJk5U7lYQ4iu8wsmr2rsGJ1rbYYsAACAAAAAgAAAAIABAAAAAQAAAAAiAgNHO/yMdwwbIgoueq5LrfbA1+rykCjVsp00OAErsonvgRgqcEdgLAAAgAAAAIAAAACAAAAAAAIAAAAAIgIDZHSv8mM8NRhlU5+1K2K51vueTiNXZijh8KCnmTRY4GwYnWtthiwAAIAAAACAAAAAgAAAAAACAAAAAA=="
             ,pcVar5);
  std::__cxx11::string::~string(local_2778);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_2758);
  if (!bVar2) {
    testing::Message::Message(&local_2780);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x248278);
    testing::internal::AssertHelper::AssertHelper
              (&local_2788,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x10a,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2788,&local_2780);
    testing::internal::AssertHelper::~AssertHelper(&local_2788);
    testing::Message::~Message((Message *)0x2482db);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x248333);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)0x248340);
  std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>::vector
            ((vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> *)0x24834d);
  cfd::core::Amount::Amount((Amount *)local_27c8);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)0x248371);
  local_27f8 = (UtxoData *)
               std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::begin(pvVar11);
  local_27f0 = (UtxoData *)
               __gnu_cxx::
               __normal_iterator<cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
               ::operator+((__normal_iterator<cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
                            *)in_stack_ffffffffffffba08,(difference_type)rhs);
  local_27e8 = (UtxoData *)
               __gnu_cxx::
               __normal_iterator<cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
               ::operator+((__normal_iterator<cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
                            *)in_stack_ffffffffffffba08,(difference_type)rhs);
  local_2800 = (UtxoData *)std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::end(pvVar11);
  local_2808 = (vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)
               std::back_inserter<std::vector<cfd::UtxoData,std::allocator<cfd::UtxoData>>>(pvVar11)
  ;
  __first._M_current._4_4_ = in_stack_ffffffffffffba2c;
  __first._M_current._0_4_ = in_stack_ffffffffffffba28;
  local_2810 = (vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)
               std::
               copy<__gnu_cxx::__normal_iterator<cfd::UtxoData*,std::vector<cfd::UtxoData,std::allocator<cfd::UtxoData>>>,std::back_insert_iterator<std::vector<cfd::UtxoData,std::allocator<cfd::UtxoData>>>>
                         (__first,in_stack_ffffffffffffba20,in_stack_ffffffffffffba18);
  cfd::CoinSelectionOption::CoinSelectionOption(local_2878);
  cfd::CoinSelectionOption::SetEffectiveFeeBaserate(2.0);
  cfd::CoinSelectionOption::SetKnapsackMinimumChange((long)local_2878);
  local_288c = 5;
  local_2898 = std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::size(&local_27e0);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((char *)in_stack_ffffffffffffba18.container,(char *)in_stack_ffffffffffffba10,
             (int *)in_stack_ffffffffffffba08,(unsigned_long *)rhs);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2888);
  if (!bVar2) {
    testing::Message::Message(&local_28a0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x248579);
    testing::internal::AssertHelper::AssertHelper
              (&local_28a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x117,pcVar5);
    testing::internal::AssertHelper::operator=(&local_28a8,&local_28a0);
    testing::internal::AssertHelper::~AssertHelper(&local_28a8);
    testing::Message::~Message((Message *)0x2485dc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x248634);
  local_28bc = 10000000;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[](&local_27e0,0);
  local_28c8 = cfd::core::Amount::GetSatoshiValue();
  testing::internal::EqHelper<false>::Compare<int,long>
            ((char *)in_stack_ffffffffffffba18.container,(char *)in_stack_ffffffffffffba10,
             (int *)in_stack_ffffffffffffba08,(long *)rhs);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_28b8);
  if (!bVar2) {
    testing::Message::Message(&local_28d0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x248715);
    testing::internal::AssertHelper::AssertHelper
              (&local_28d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x118,pcVar5);
    testing::internal::AssertHelper::operator=(&local_28d8,&local_28d0);
    testing::internal::AssertHelper::~AssertHelper(&local_28d8);
    testing::Message::~Message((Message *)0x248778);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2487d0);
  local_28ec = 6;
  local_28f0 = cfd::core::Psbt::GetTxInCount();
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((char *)in_stack_ffffffffffffba18.container,(char *)in_stack_ffffffffffffba10,
             (int *)in_stack_ffffffffffffba08,(uint *)rhs);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_28e8);
  if (!bVar2) {
    testing::Message::Message(&local_28f8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x24889b);
    testing::internal::AssertHelper::AssertHelper
              (&local_2900,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x119,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2900,&local_28f8);
    testing::internal::AssertHelper::~AssertHelper(&local_2900);
    testing::Message::~Message((Message *)0x2488fe);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x248956);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[](&local_27e0,0);
  cfd::core::Txid::GetHex_abi_cxx11_();
  pcVar5 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_2910,
             "\"8b3a1f738009f99fd8b01e1ad95c5468e8fb25d5373df19697d78eec957c423c\"",
             "selection_utxo[0].txid.GetHex().c_str()",
             "8b3a1f738009f99fd8b01e1ad95c5468e8fb25d5373df19697d78eec957c423c",pcVar5);
  std::__cxx11::string::~string(local_2930);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2910);
  if (!bVar2) {
    testing::Message::Message(&local_2938);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x248a53);
    testing::internal::AssertHelper::AssertHelper
              (&local_2940,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x11b,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2940,&local_2938);
    testing::internal::AssertHelper::~AssertHelper(&local_2940);
    testing::Message::~Message((Message *)0x248ab6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x248b0b);
  local_2954 = 7;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[](&local_27e0,0);
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((char *)in_stack_ffffffffffffba18.container,(char *)in_stack_ffffffffffffba10,
             (int *)in_stack_ffffffffffffba08,(uint *)rhs);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2950);
  if (!bVar2) {
    testing::Message::Message(&local_2960);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x248bc2);
    testing::internal::AssertHelper::AssertHelper
              (&local_2968,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x11c,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2968,&local_2960);
    testing::internal::AssertHelper::~AssertHelper(&local_2968);
    testing::Message::~Message((Message *)0x248c25);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x248c7a);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[](&local_27e0,0);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_2978,
             "\"wpkh([2a704760/44\'/0\'/0\'/1/7]03c02325c328fed622a9d88f8f5318e05261a3c3a967b7211d7d67657e2b5e9fbe)\""
             ,"selection_utxo[0].descriptor.c_str()",
             "wpkh([2a704760/44\'/0\'/0\'/1/7]03c02325c328fed622a9d88f8f5318e05261a3c3a967b7211d7d67657e2b5e9fbe)"
             ,pcVar5);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2978);
  if (!bVar2) {
    testing::Message::Message(&local_2980);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x248d30);
    testing::internal::AssertHelper::AssertHelper
              (&local_2988,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x11d,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2988,&local_2980);
    testing::internal::AssertHelper::~AssertHelper(&local_2988);
    testing::Message::~Message((Message *)0x248d93);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x248deb);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[](&local_27e0,1);
  cfd::core::Txid::GetHex_abi_cxx11_();
  pcVar5 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_2998,
             "\"0e5b0e16148da878ee8d9f0524ac0962a22dbbb66e2dc8a6237a1d4c8c4ea9cb\"",
             "selection_utxo[1].txid.GetHex().c_str()",
             "0e5b0e16148da878ee8d9f0524ac0962a22dbbb66e2dc8a6237a1d4c8c4ea9cb",pcVar5);
  std::__cxx11::string::~string(local_29b8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2998);
  if (!bVar2) {
    testing::Message::Message(&local_29c0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x248ee9);
    testing::internal::AssertHelper::AssertHelper
              (&local_29c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x11e,pcVar5);
    testing::internal::AssertHelper::operator=(&local_29c8,&local_29c0);
    testing::internal::AssertHelper::~AssertHelper(&local_29c8);
    testing::Message::~Message((Message *)0x248f4c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x248fa1);
  local_29dc = 8;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[](&local_27e0,1);
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((char *)in_stack_ffffffffffffba18.container,(char *)in_stack_ffffffffffffba10,
             (int *)in_stack_ffffffffffffba08,(uint *)rhs);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_29d8);
  if (!bVar2) {
    testing::Message::Message(&local_29e8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x249059);
    testing::internal::AssertHelper::AssertHelper
              (&local_29f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x11f,pcVar5);
    testing::internal::AssertHelper::operator=(&local_29f0,&local_29e8);
    testing::internal::AssertHelper::~AssertHelper(&local_29f0);
    testing::Message::~Message((Message *)0x2490bc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x249111);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[](&local_27e0,1);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_2a00,
             "\"wpkh([2a704760/44\'/0\'/0\'/1/8]02f505e0b5885959bd2f7e68dd73915940a5540e05c41a42f6c598ceb21bdc55f3)\""
             ,"selection_utxo[1].descriptor.c_str()",
             "wpkh([2a704760/44\'/0\'/0\'/1/8]02f505e0b5885959bd2f7e68dd73915940a5540e05c41a42f6c598ceb21bdc55f3)"
             ,pcVar5);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2a00);
  if (!bVar2) {
    testing::Message::Message(&local_2a08);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x2491c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_2a10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x120,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2a10,&local_2a08);
    testing::internal::AssertHelper::~AssertHelper(&local_2a10);
    testing::Message::~Message((Message *)0x24922b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x249283);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[](&local_27e0,2);
  cfd::core::Txid::GetHex_abi_cxx11_();
  pcVar5 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_2a20,
             "\"016b36a0a9df54d55f7b907aba8fdd3d90d797eee2bc46c5ed7dced41218e674\"",
             "selection_utxo[2].txid.GetHex().c_str()",
             "016b36a0a9df54d55f7b907aba8fdd3d90d797eee2bc46c5ed7dced41218e674",pcVar5);
  std::__cxx11::string::~string(local_2a40);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2a20);
  if (!bVar2) {
    testing::Message::Message(&local_2a48);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x249381);
    testing::internal::AssertHelper::AssertHelper
              (&local_2a50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x121,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2a50,&local_2a48);
    testing::internal::AssertHelper::~AssertHelper(&local_2a50);
    testing::Message::~Message((Message *)0x2493e4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x249439);
  local_2a64 = 9;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[](&local_27e0,2);
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((char *)in_stack_ffffffffffffba18.container,(char *)in_stack_ffffffffffffba10,
             (int *)in_stack_ffffffffffffba08,(uint *)rhs);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2a60);
  if (!bVar2) {
    testing::Message::Message(&local_2a70);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x2494f1);
    testing::internal::AssertHelper::AssertHelper
              (&local_2a78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x122,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2a78,&local_2a70);
    testing::internal::AssertHelper::~AssertHelper(&local_2a78);
    testing::Message::~Message((Message *)0x249554);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2495a9);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[](&local_27e0,2);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_2a88,
             "\"wpkh([2a704760/44\'/0\'/0\'/1/9]02f7af7e1c3c8627e0e662ba04ec003879d9aeaeba5a02a1e24804ef4d7b497db4)\""
             ,"selection_utxo[2].descriptor.c_str()",
             "wpkh([2a704760/44\'/0\'/0\'/1/9]02f7af7e1c3c8627e0e662ba04ec003879d9aeaeba5a02a1e24804ef4d7b497db4)"
             ,pcVar5);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2a88);
  if (!bVar2) {
    testing::Message::Message(&local_2a90);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x249660);
    testing::internal::AssertHelper::AssertHelper
              (&local_2a98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x123,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2a98,&local_2a90);
    testing::internal::AssertHelper::~AssertHelper(&local_2a98);
    testing::Message::~Message((Message *)0x2496c3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x24971b);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[](&local_27e0,3);
  cfd::core::Txid::GetHex_abi_cxx11_();
  pcVar5 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_2aa8,
             "\"dcc65ebfb8535f96f8a51e07d5c0a94f965000bd5765159a3cc27e4edd658c69\"",
             "selection_utxo[3].txid.GetHex().c_str()",
             "dcc65ebfb8535f96f8a51e07d5c0a94f965000bd5765159a3cc27e4edd658c69",pcVar5);
  std::__cxx11::string::~string(local_2ac8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2aa8);
  if (!bVar2) {
    testing::Message::Message(&local_2ad0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x249819);
    testing::internal::AssertHelper::AssertHelper
              (&local_2ad8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x124,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2ad8,&local_2ad0);
    testing::internal::AssertHelper::~AssertHelper(&local_2ad8);
    testing::Message::~Message((Message *)0x24987c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2498d1);
  local_2aec = 10;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[](&local_27e0,3);
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((char *)in_stack_ffffffffffffba18.container,(char *)in_stack_ffffffffffffba10,
             (int *)in_stack_ffffffffffffba08,(uint *)rhs);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2ae8);
  if (!bVar2) {
    testing::Message::Message(&local_2af8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x249989);
    testing::internal::AssertHelper::AssertHelper
              (&local_2b00,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x125,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2b00,&local_2af8);
    testing::internal::AssertHelper::~AssertHelper(&local_2b00);
    testing::Message::~Message((Message *)0x2499ec);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x249a41);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[](&local_27e0,3);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_2b10,
             "\"wpkh([2a704760/44\'/0\'/0\'/1/10]03c04e76f9bc7d6433a6eb7c0c3c446213c5f361dae22929483f23718e1cee4ece)\""
             ,"selection_utxo[3].descriptor.c_str()",
             "wpkh([2a704760/44\'/0\'/0\'/1/10]03c04e76f9bc7d6433a6eb7c0c3c446213c5f361dae22929483f23718e1cee4ece)"
             ,pcVar5);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2b10);
  if (!bVar2) {
    testing::Message::Message(&local_2b18);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x249af8);
    testing::internal::AssertHelper::AssertHelper
              (&local_2b20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x126,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2b20,&local_2b18);
    testing::internal::AssertHelper::~AssertHelper(&local_2b20);
    testing::Message::~Message((Message *)0x249b5b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x249bb3);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[](&local_27e0,4);
  cfd::core::Txid::GetHex_abi_cxx11_();
  pcVar5 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_2b30,
             "\"0230e7471501f9432f727583f2bc17c11f5c1132140319ba2d7a5a0145684c73\"",
             "selection_utxo[4].txid.GetHex().c_str()",
             "0230e7471501f9432f727583f2bc17c11f5c1132140319ba2d7a5a0145684c73",pcVar5);
  std::__cxx11::string::~string(local_2b50);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2b30);
  if (!bVar2) {
    testing::Message::Message(&local_2b58);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x249cb1);
    testing::internal::AssertHelper::AssertHelper
              (&local_2b60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x127,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2b60,&local_2b58);
    testing::internal::AssertHelper::~AssertHelper(&local_2b60);
    testing::Message::~Message((Message *)0x249d14);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x249d69);
  local_2b74 = 0xb;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[](&local_27e0,4);
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((char *)in_stack_ffffffffffffba18.container,(char *)in_stack_ffffffffffffba10,
             (int *)in_stack_ffffffffffffba08,(uint *)rhs);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2b70);
  if (!bVar2) {
    testing::Message::Message(&local_2b80);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x249e21);
    testing::internal::AssertHelper::AssertHelper
              (&local_2b88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x128,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2b88,&local_2b80);
    testing::internal::AssertHelper::~AssertHelper(&local_2b88);
    testing::Message::~Message((Message *)0x249e84);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x249ed9);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[](&local_27e0,4);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_2b98,
             "\"wpkh([2a704760/44\'/0\'/0\'/1/11]03798ff13e5d17c6f8c1d69ff18d516613be2fa52149b3a8c60ef959d1075a5889)\""
             ,"selection_utxo[4].descriptor.c_str()",
             "wpkh([2a704760/44\'/0\'/0\'/1/11]03798ff13e5d17c6f8c1d69ff18d516613be2fa52149b3a8c60ef959d1075a5889)"
             ,pcVar5);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2b98);
  if (!bVar2) {
    testing::Message::Message(&local_2ba0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x249f90);
    testing::internal::AssertHelper::AssertHelper
              (&local_2ba8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x129,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2ba8,&local_2ba0);
    testing::internal::AssertHelper::~AssertHelper(&local_2ba8);
    testing::Message::~Message((Message *)0x249ff3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x24a04b);
  this_00 = (KeyData *)((ulong)rhs & 0xffffffff00000000);
  pvVar11 = (vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)0x0;
  expected_predicate_value = local_2878;
  cfd::Psbt::FundTransaction
            (local_2bc0,2.0,(Descriptor *)&local_538,(Amount *)&local_27e0,
             (CoinSelectionOption *)local_3c8,local_27c8,(NetType)expected_predicate_value);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator=
            (in_stack_ffffffffffffba10,
             (vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)in_stack_ffffffffffffba08);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(in_stack_ffffffffffffba10);
  local_2bd8 = cfd::core::Amount::GetSatoshiValue();
  local_2bdc = 0x48e;
  testing::internal::EqHelper<false>::Compare<long,int>
            ((char *)in_stack_ffffffffffffba18.container,(char *)in_stack_ffffffffffffba10,
             (long *)in_stack_ffffffffffffba08,(int *)this_00);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2bd0);
  if (!bVar2) {
    testing::Message::Message(&local_2be8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x24a193);
    testing::internal::AssertHelper::AssertHelper
              (&local_2bf0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x12d,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2bf0,&local_2be8);
    testing::internal::AssertHelper::~AssertHelper(&local_2bf0);
    testing::Message::~Message((Message *)0x24a1f6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x24a24b);
  for (local_2bf4 = 0; local_2bf4 < local_cac; local_2bf4 = local_2bf4 + 1) {
    std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>::operator[]
              (&local_400,(ulong)local_2bf4);
    std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>::push_back
              ((vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> *)
               in_stack_ffffffffffffba10,(value_type *)in_stack_ffffffffffffba08);
  }
  local_2c00 = local_27a0;
  local_2c08._M_current =
       (UtxoData *)std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::begin(pvVar11);
  local_2c10 = (UtxoData *)std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::end(pvVar11);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
                             *)this_00,
                            (__normal_iterator<cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
                             *)pvVar11), bVar2) {
    local_2c18 = __gnu_cxx::
                 __normal_iterator<cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
                 ::operator*(&local_2c08);
    for (local_2c20 = (ulong)local_cac; uVar1 = local_2c20,
        sVar6 = std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::size(&local_418),
        uVar1 < sVar6; local_2c20 = local_2c20 + 1) {
      iVar4 = *(int *)(local_2c18 + 0x48);
      pvVar9 = std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[]
                         (&local_418,local_2c20);
      if (iVar4 == *(int *)(pvVar9 + 0x48)) {
        pTVar7 = (Txid *)(local_2c18 + 0x28);
        std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[]
                  (&local_418,local_2c20);
        bVar3 = cfd::core::Txid::Equals(pTVar7);
        if ((bVar3 & 1) != 0) {
          std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>::operator[]
                    (&local_400,local_2c20);
          std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>::push_back
                    ((vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> *)
                     in_stack_ffffffffffffba10,(value_type *)in_stack_ffffffffffffba08);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
    ::operator++(&local_2c08);
  }
  cfd::core::Psbt::GetBase64_abi_cxx11_();
  pcVar5 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_2c30,
             "\"cHNidP8BAP2GAQIAAAAH+DTafLXhg/yBX3hGInKEZg+koKWDviv7SlNb9CXlMd4BAAAAAP////9a72o7znYklRrluejAkI6P90ch7t96CZTVvx78fe6CgQIAAAAA/////6kt1klSeJ79FESTjpzlsQbnKACJxNxKeLPafHoradk/AwAAAAD//////Pcse7iIGUWVXkj1TmCBtRkBg2SE5cSKmSUGECnEBdEEAAAAAP////+gvhpNmiLIMtLSCjoITwENCamrQfs+Le29RusBBFePuQUAAAAA/////3GhQb9bZT4sQ3czBdaajJh2lERwyh4p5LA6CVPEvraVAQAAAAD/////PEJ8leyO15eW8T031SX76GhUXNkaHrDYn/kJgHMfOosHAAAAAP////8DgPD6AgAAAAAWABSzIr3c5jO4UaxzcKtFTws2egZU5YDw+gIAAAAAFgAUyrjFOm6PwCltHNORWjB9UcSRpVXykZgAAAAAABYAFCtuFro44oBQD4CyxXBu8C841ZCBAAAAAAABAR+AlpgAAAAAABYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgYCVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv4YKnBHYCwAAIAAAACAAAAAgAEAAAABAAAAAAEBH4CWmAAAAAAAFgAUi/CdYLfjTzSCfY28scdjkKkWyoIiBgInRM+yQ24VYEDsHI/oQtnvmhjLQK1B8xJyU5DDX3vTaxgqcEdgLAAAgAAAAIAAAACAAQAAAAIAAAAAAQEfgJaYAAAAAAAWABTx0+5ngpIl64ksyrAeIvand+fiHiIGAufo3CNvoCQ2lAjSzk2FCASCYavCl7gRYE2gh61x0ThVGCpwR2AsAACAAAAAgAAAAIABAAAAAwAAAAABAR+AlpgAAAAAABYAFBnWX4MosiBtmXB4VmDsDTSAj7B1IgYDPYdL8ZtpfPbGOWWVR6WDuGcwFkpbbbAb8goU65tq20QYKnBHYCwAAIAAAACAAAAAgAEAAAAEAAAAAAEBH4CWmAAAAAAAFgAUEreVSnXvwqIOhuMtwteGR9ZwB3kiBgL7Bhcw2948gGtKF6mfRUyBKCrs7m1G9Kl1qUzf06BlBBgqcEdgLAAAgAAAAIAAAACAAQAAAAUAAAAAAQEfgPD6AgAAAAAWABSXipBGDkRnGlL0mgm7WcxnlLY8iSIGA+PSRKOWfguHdl/ahsX/OIhfdJk5U7lYQ4iu8wsmr2rsGJ1rbYYsAACAAAAAgAAAAIABAAAAAQAAAAABAR+AlpgAAAAAABYAFBzoeOOg2js0MIeX/ey3YiH4VBivIgYDwCMlwyj+1iKp2I+PUxjgUmGjw6lntyEdfWdlfiten74YKnBHYCwAAIAAAACAAAAAgAEAAAAHAAAAACICA0c7/Ix3DBsiCi56rkut9sDX6vKQKNWynTQ4ASuyie+BGCpwR2AsAACAAAAAgAAAAIAAAAAAAgAAAAAiAgNkdK/yYzw1GGVTn7UrYrnW+55OI1dmKOHwoKeZNFjgbBida22GLAAAgAAAAIAAAACAAAAAAAIAAAAAIgIC9/DX0AKJt8Wlgbw1J2BAw0jeSPxBQGfzHqJq2VwAVQwYKnBHYCwAAIAAAACAAAAAgAEAAABkAAAAAA==\""
             ,"psbt.GetBase64().c_str()",
             "cHNidP8BAP2GAQIAAAAH+DTafLXhg/yBX3hGInKEZg+koKWDviv7SlNb9CXlMd4BAAAAAP////9a72o7znYklRrluejAkI6P90ch7t96CZTVvx78fe6CgQIAAAAA/////6kt1klSeJ79FESTjpzlsQbnKACJxNxKeLPafHoradk/AwAAAAD//////Pcse7iIGUWVXkj1TmCBtRkBg2SE5cSKmSUGECnEBdEEAAAAAP////+gvhpNmiLIMtLSCjoITwENCamrQfs+Le29RusBBFePuQUAAAAA/////3GhQb9bZT4sQ3czBdaajJh2lERwyh4p5LA6CVPEvraVAQAAAAD/////PEJ8leyO15eW8T031SX76GhUXNkaHrDYn/kJgHMfOosHAAAAAP////8DgPD6AgAAAAAWABSzIr3c5jO4UaxzcKtFTws2egZU5YDw+gIAAAAAFgAUyrjFOm6PwCltHNORWjB9UcSRpVXykZgAAAAAABYAFCtuFro44oBQD4CyxXBu8C841ZCBAAAAAAABAR+AlpgAAAAAABYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgYCVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv4YKnBHYCwAAIAAAACAAAAAgAEAAAABAAAAAAEBH4CWmAAAAAAAFgAUi/CdYLfjTzSCfY28scdjkKkWyoIiBgInRM+yQ24VYEDsHI/oQtnvmhjLQK1B8xJyU5DDX3vTaxgqcEdgLAAAgAAAAIAAAACAAQAAAAIAAAAAAQEfgJaYAAAAAAAWABTx0+5ngpIl64ksyrAeIvand+fiHiIGAufo3CNvoCQ2lAjSzk2FCASCYavCl7gRYE2gh61x0ThVGCpwR2AsAACAAAAAgAAAAIABAAAAAwAAAAABAR+AlpgAAAAAABYAFBnWX4MosiBtmXB4VmDsDTSAj7B1IgYDPYdL8ZtpfPbGOWWVR6WDuGcwFkpbbbAb8goU65tq20QYKnBHYCwAAIAAAACAAAAAgAEAAAAEAAAAAAEBH4CWmAAAAAAAFgAUEreVSnXvwqIOhuMtwteGR9ZwB3kiBgL7Bhcw2948gGtKF6mfRUyBKCrs7m1G9Kl1qUzf06BlBBgqcEdgLAAAgAAAAIAAAACAAQAAAAUAAAAAAQEfgPD6AgAAAAAWABSXipBGDkRnGlL0mgm7WcxnlLY8iSIGA+PSRKOWfguHdl/ahsX/OIhfdJk5U7lYQ4iu8wsmr2rsGJ1rbYYsAACAAAAAgAAAAIABAAAAAQAAAAABAR+AlpgAAAAAABYAFBzoeOOg2js0MIeX/ey3YiH4VBivIgYDwCMlwyj+1iKp2I+PUxjgUmGjw6lntyEdfWdlfiten74YKnBHYCwAAIAAAACAAAAAgAEAAAAHAAAAACICA0c7/Ix3DBsiCi56rkut9sDX6vKQKNWynTQ4ASuyie+BGCpwR2AsAACAAAAAgAAAAIAAAAAAAgAAAAAiAgNkdK/yYzw1GGVTn7UrYrnW+55OI1dmKOHwoKeZNFjgbBida22GLAAAgAAAAIAAAACAAAAAAAIAAAAAIgIC9/DX0AKJt8Wlgbw1J2BAw0jeSPxBQGfzHqJq2VwAVQwYKnBHYCwAAIAAAACAAAAAgAEAAABkAAAAAA=="
             ,pcVar5);
  std::__cxx11::string::~string(local_2c50);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2c30);
  if (!bVar2) {
    testing::Message::Message(&local_2c58);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x24a51e);
    testing::internal::AssertHelper::AssertHelper
              (&local_2c60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x13a,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2c60,&local_2c58);
    testing::internal::AssertHelper::~AssertHelper(&local_2c60);
    testing::Message::~Message((Message *)0x24a581);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x24a5d6);
  cfd::CoinSelectionOption::~CoinSelectionOption((CoinSelectionOption *)0x24a5e3);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(in_stack_ffffffffffffba10);
  cfd::Psbt::operator=(&local_c28,&local_538);
  local_2c90 = &local_400;
  local_2c98._M_current =
       (Privkey *)
       std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>::begin
                 ((vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> *)pvVar11);
  local_2ca0 = (Privkey *)
               std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>::end
                         ((vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> *)pvVar11
                         );
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<cfd::core::Privkey_*,_std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>_>
                             *)this_00,
                            (__normal_iterator<cfd::core::Privkey_*,_std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>_>
                             *)pvVar11), bVar2) {
    local_2ca8 = __gnu_cxx::
                 __normal_iterator<cfd::core::Privkey_*,_std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>_>
                 ::operator*(&local_2c98);
    cfd::core::Psbt::Sign((Privkey *)&local_c28,SUB81(local_2ca8,0));
    __gnu_cxx::
    __normal_iterator<cfd::core::Privkey_*,_std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>_>
    ::operator++(&local_2c98);
  }
  cfd::Psbt::operator=(&local_ca8,&local_538);
  pvVar8 = std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>::operator[]
                     ((vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> *)local_468,0
                     );
  cfd::core::Psbt::Sign((Privkey *)&local_ca8,SUB81(pvVar8,0));
  cfd::core::Psbt::Combine(&local_538.super_Psbt);
  cfd::core::Psbt::Combine(&local_538.super_Psbt);
  cfd::core::Psbt::GetData();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar5 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_2d08,
             "\"70736274ff0100fd86010200000007f834da7cb5e183fc815f7846227284660fa4a0a583be2bfb4a535bf425e531de0100000000ffffffff5aef6a3bce7624951ae5b9e8c0908e8ff74721eedf7a0994d5bf1efc7dee82810200000000ffffffffa92dd64952789efd1444938e9ce5b106e7280089c4dc4a78b3da7c7a2b69d93f0300000000fffffffffcf72c7bb8881945955e48f54e6081b51901836484e5c48a9925061029c405d10400000000ffffffffa0be1a4d9a22c832d2d20a3a084f010d09a9ab41fb3e2dedbd46eb0104578fb90500000000ffffffff71a141bf5b653e2c43773305d69a8c9876944470ca1e29e4b03a0953c4beb6950100000000ffffffff3c427c95ec8ed79796f13d37d525fbe868545cd91a1eb0d89ff90980731f3a8b0700000000ffffffff0380f0fa0200000000160014b322bddce633b851ac7370ab454f0b367a0654e580f0fa0200000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a555f2919800000000001600142b6e16ba38e280500f80b2c5706ef02f38d59081000000000001011f8096980000000000160014962c4e08f336d3afbc3415c9d359ae1040470520220202565248460b3c186decf13db06f0724fd50b47cc3e489c30076c8363d5038cefe473044022016d6be246613d8f20a98f79651ba6402352478bde005ba292adee40c3060f97a022061e5e264be9a892f4579bcbcd5c660405d3b95adb807c8b54caf3dc22f75f9fd01220602565248460b3c186decf13db06f0724fd50b47cc3e489c30076c8363d5038cefe182a7047602c000080000000800000008001000000010000000001011f80969800000000001600148bf09d60b7e34f34827d8dbcb1c76390a916ca822202022744cfb2436e156040ec1c8fe842d9ef9a18cb40ad41f312725390c35f7bd36b4730440220622277094f292704dfbcd95c951b95f83f8ae85b0584d0a6058548a7a0ae814e02200b913ac3fcce9780911e927997442af8de0945f03a9576a2c300bdebe08c6182012206022744cfb2436e156040ec1c8fe842d9ef9a18cb40ad41f312725390c35f7bd36b182a7047602c000080000000800000008001000000020000000001011f8096980000000000160014f1d3ee67829225eb892ccab01e22f6a777e7e21e220202e7e8dc236fa024369408d2ce4d8508048261abc297b811604da087ad71d1385547304402202dc3146d944ac124e6964730524e73b3600ce84ec4c286cbcccfe7eb25cfb2a30220701661116a179ce213c14280073253c3467ef8e8a7324618ac263e337046b3a601220602e7e8dc236fa024369408d2ce4d8508048261abc297b811604da087ad71d13855182a7047602c000080000000800000008001000000030000000001011f809698000000000016001419d65..." /* TRUNCATED STRING LITERAL */
             ,"psbt.GetData().GetHex().c_str()",
             "70736274ff0100fd86010200000007f834da7cb5e183fc815f7846227284660fa4a0a583be2bfb4a535bf425e531de0100000000ffffffff5aef6a3bce7624951ae5b9e8c0908e8ff74721eedf7a0994d5bf1efc7dee82810200000000ffffffffa92dd64952789efd1444938e9ce5b106e7280089c4dc4a78b3da7c7a2b69d93f0300000000fffffffffcf72c7bb8881945955e48f54e6081b51901836484e5c48a9925061029c405d10400000000ffffffffa0be1a4d9a22c832d2d20a3a084f010d09a9ab41fb3e2dedbd46eb0104578fb90500000000ffffffff71a141bf5b653e2c43773305d69a8c9876944470ca1e29e4b03a0953c4beb6950100000000ffffffff3c427c95ec8ed79796f13d37d525fbe868545cd91a1eb0d89ff90980731f3a8b0700000000ffffffff0380f0fa0200000000160014b322bddce633b851ac7370ab454f0b367a0654e580f0fa0200000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a555f2919800000000001600142b6e16ba38e280500f80b2c5706ef02f38d59081000000000001011f8096980000000000160014962c4e08f336d3afbc3415c9d359ae1040470520220202565248460b3c186decf13db06f0724fd50b47cc3e489c30076c8363d5038cefe473044022016d6be246613d8f20a98f79651ba6402352478bde005ba292adee40c3060f97a022061e5e264be9a892f4579bcbcd5c660405d3b95adb807c8b54caf3dc22f75f9fd01220602565248460b3c186decf13db06f0724fd50b47cc3e489c30076c8363d5038cefe182a7047602c000080000000800000008001000000010000000001011f80969800000000001600148bf09d60b7e34f34827d8dbcb1c76390a916ca822202022744cfb2436e156040ec1c8fe842d9ef9a18cb40ad41f312725390c35f7bd36b4730440220622277094f292704dfbcd95c951b95f83f8ae85b0584d0a6058548a7a0ae814e02200b913ac3fcce9780911e927997442af8de0945f03a9576a2c300bdebe08c6182012206022744cfb2436e156040ec1c8fe842d9ef9a18cb40ad41f312725390c35f7bd36b182a7047602c000080000000800000008001000000020000000001011f8096980000000000160014f1d3ee67829225eb892ccab01e22f6a777e7e21e220202e7e8dc236fa024369408d2ce4d8508048261abc297b811604da087ad71d1385547304402202dc3146d944ac124e6964730524e73b3600ce84ec4c286cbcccfe7eb25cfb2a30220701661116a179ce213c14280073253c3467ef8e8a7324618ac263e337046b3a601220602e7e8dc236fa024369408d2ce4d8508048261abc297b811604da087ad71d13855182a7047602c000080000000800000008001000000030000000001011f809698000000000016001419d65f..." /* TRUNCATED STRING LITERAL */
             ,pcVar5);
  std::__cxx11::string::~string(local_2d28);
  cfd::core::ByteData::~ByteData((ByteData *)0x24ae1e);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_2d08);
  if (!bVar2) {
    testing::Message::Message(local_2d48);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x24aee0);
    testing::internal::AssertHelper::AssertHelper
              (&local_2d50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x157,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2d50,local_2d48);
    testing::internal::AssertHelper::~AssertHelper(&local_2d50);
    testing::Message::~Message((Message *)0x24af43);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x24af9b);
  cfd::core::Psbt::GetBase64_abi_cxx11_();
  pcVar5 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_2d60,
             "\"cHNidP8BAP2GAQIAAAAH+DTafLXhg/yBX3hGInKEZg+koKWDviv7SlNb9CXlMd4BAAAAAP////9a72o7znYklRrluejAkI6P90ch7t96CZTVvx78fe6CgQIAAAAA/////6kt1klSeJ79FESTjpzlsQbnKACJxNxKeLPafHoradk/AwAAAAD//////Pcse7iIGUWVXkj1TmCBtRkBg2SE5cSKmSUGECnEBdEEAAAAAP////+gvhpNmiLIMtLSCjoITwENCamrQfs+Le29RusBBFePuQUAAAAA/////3GhQb9bZT4sQ3czBdaajJh2lERwyh4p5LA6CVPEvraVAQAAAAD/////PEJ8leyO15eW8T031SX76GhUXNkaHrDYn/kJgHMfOosHAAAAAP////8DgPD6AgAAAAAWABSzIr3c5jO4UaxzcKtFTws2egZU5YDw+gIAAAAAFgAUyrjFOm6PwCltHNORWjB9UcSRpVXykZgAAAAAABYAFCtuFro44oBQD4CyxXBu8C841ZCBAAAAAAABAR+AlpgAAAAAABYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgICVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv5HMEQCIBbWviRmE9jyCpj3llG6ZAI1JHi94AW6KSre5AwwYPl6AiBh5eJkvpqJL0V5vLzVxmBAXTuVrbgHyLVMrz3CL3X5/QEiBgJWUkhGCzwYbezxPbBvByT9ULR8w+SJwwB2yDY9UDjO/hgqcEdgLAAAgAAAAIAAAACAAQAAAAEAAAAAAQEfgJaYAAAAAAAWABSL8J1gt+NPNIJ9jbyxx2OQqRbKgiICAidEz7JDbhVgQOwcj+hC2e+aGMtArUHzEnJTkMNfe9NrRzBEAiBiIncJTyknBN+82VyVG5X4P4roWwWE0KYFhUinoK6BTgIgC5E6w/zOl4CRHpJ5l0Qq+N4JRfA6lXaiwwC96+CMYYIBIgYCJ0TPskNuFWBA7ByP6ELZ75oYy0CtQfMSclOQw19702sYKnBHYCwAAIAAAACAAAAAgAEAAAACAAAAAAEBH4CWmAAAAAAAFgAU8dPuZ4KSJeuJLMqwHiL2p3fn4h4iAgLn6Nwjb6AkNpQI0s5NhQgEgmGrwpe4EWBNoIetcdE4VUcwRAIgLcMUbZRKwSTmlkcwUk5zs2AM6E7EwobLzM/n6yXPsqMCIHAWYRFqF5ziE8FCgAcyU8NGfvjopzJGGKwmPjNwRrOmASIGAufo3CNvoCQ2lAjSzk2FCASCYavCl7gRYE2gh61x0ThVGCpwR2AsAACAAAAAgAAAAIABAAAAAwAAAAABAR+AlpgAAAAAABYAFBnWX4MosiBtmXB4VmDsDTSAj7B1IgIDPYdL8ZtpfPbGOWWVR6WDuGcwFkpbbbAb8goU65tq20RHMEQCIGK3Va0fEc0AG7l0R4jE24fZAlPTN/NwSMspUp6s2FQFAiBIO7xBB3x6McuvfcAqytBeKOQtKjIkyZz7MQZPohAVsAEiBgM9h0vxm2l89sY5ZZVHpYO4ZzAWSlttsBvyChTrm2rbRBgqcEdgLAAAgAAAAIAAAACAAQAAAAQAAAAAAQEfgJaYAAAAAAAWABQSt5VKde/Cog6G4y3C14ZH1nAHeSICAvsGFzDb3jyAa0oXqZ9FTIEoKuzubUb0qXWpTN/ToGUERzBEAiBl71BmnLeASoN7Eccn+KSJHeO0CFRMW4F/7UGzos29ZwIgRrOAs3PCNo/9znOpsrD2NO+DkVrqnmdxM8rq6GGiT4gBIgYC+wYXMNvePIBrShepn0VMgSgq7O5tRvSpdalM39OgZQQYKnBHYCwAAIAAAACAAAAAgAEAAAAFAAAAAAEBH4Dw+gIAAAAAFgAUl4qQRg5EZxpS9JoJu1nMZ5S2PIkiAgPj0kSjln4Lh3Zf2obF/ziIX3SZOVO5WEOIrvMLJq9q7EcwRAIgd5Ug2usK5Ycn3yV4VDzjKgYO107KhsRIIOUqzsQwE9ECIAl7CBVQYmK/lygnbbOqIng..." /* TRUNCATED STRING LITERAL */
             ,"psbt.GetBase64().c_str()",
             "cHNidP8BAP2GAQIAAAAH+DTafLXhg/yBX3hGInKEZg+koKWDviv7SlNb9CXlMd4BAAAAAP////9a72o7znYklRrluejAkI6P90ch7t96CZTVvx78fe6CgQIAAAAA/////6kt1klSeJ79FESTjpzlsQbnKACJxNxKeLPafHoradk/AwAAAAD//////Pcse7iIGUWVXkj1TmCBtRkBg2SE5cSKmSUGECnEBdEEAAAAAP////+gvhpNmiLIMtLSCjoITwENCamrQfs+Le29RusBBFePuQUAAAAA/////3GhQb9bZT4sQ3czBdaajJh2lERwyh4p5LA6CVPEvraVAQAAAAD/////PEJ8leyO15eW8T031SX76GhUXNkaHrDYn/kJgHMfOosHAAAAAP////8DgPD6AgAAAAAWABSzIr3c5jO4UaxzcKtFTws2egZU5YDw+gIAAAAAFgAUyrjFOm6PwCltHNORWjB9UcSRpVXykZgAAAAAABYAFCtuFro44oBQD4CyxXBu8C841ZCBAAAAAAABAR+AlpgAAAAAABYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgICVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv5HMEQCIBbWviRmE9jyCpj3llG6ZAI1JHi94AW6KSre5AwwYPl6AiBh5eJkvpqJL0V5vLzVxmBAXTuVrbgHyLVMrz3CL3X5/QEiBgJWUkhGCzwYbezxPbBvByT9ULR8w+SJwwB2yDY9UDjO/hgqcEdgLAAAgAAAAIAAAACAAQAAAAEAAAAAAQEfgJaYAAAAAAAWABSL8J1gt+NPNIJ9jbyxx2OQqRbKgiICAidEz7JDbhVgQOwcj+hC2e+aGMtArUHzEnJTkMNfe9NrRzBEAiBiIncJTyknBN+82VyVG5X4P4roWwWE0KYFhUinoK6BTgIgC5E6w/zOl4CRHpJ5l0Qq+N4JRfA6lXaiwwC96+CMYYIBIgYCJ0TPskNuFWBA7ByP6ELZ75oYy0CtQfMSclOQw19702sYKnBHYCwAAIAAAACAAAAAgAEAAAACAAAAAAEBH4CWmAAAAAAAFgAU8dPuZ4KSJeuJLMqwHiL2p3fn4h4iAgLn6Nwjb6AkNpQI0s5NhQgEgmGrwpe4EWBNoIetcdE4VUcwRAIgLcMUbZRKwSTmlkcwUk5zs2AM6E7EwobLzM/n6yXPsqMCIHAWYRFqF5ziE8FCgAcyU8NGfvjopzJGGKwmPjNwRrOmASIGAufo3CNvoCQ2lAjSzk2FCASCYavCl7gRYE2gh61x0ThVGCpwR2AsAACAAAAAgAAAAIABAAAAAwAAAAABAR+AlpgAAAAAABYAFBnWX4MosiBtmXB4VmDsDTSAj7B1IgIDPYdL8ZtpfPbGOWWVR6WDuGcwFkpbbbAb8goU65tq20RHMEQCIGK3Va0fEc0AG7l0R4jE24fZAlPTN/NwSMspUp6s2FQFAiBIO7xBB3x6McuvfcAqytBeKOQtKjIkyZz7MQZPohAVsAEiBgM9h0vxm2l89sY5ZZVHpYO4ZzAWSlttsBvyChTrm2rbRBgqcEdgLAAAgAAAAIAAAACAAQAAAAQAAAAAAQEfgJaYAAAAAAAWABQSt5VKde/Cog6G4y3C14ZH1nAHeSICAvsGFzDb3jyAa0oXqZ9FTIEoKuzubUb0qXWpTN/ToGUERzBEAiBl71BmnLeASoN7Eccn+KSJHeO0CFRMW4F/7UGzos29ZwIgRrOAs3PCNo/9znOpsrD2NO+DkVrqnmdxM8rq6GGiT4gBIgYC+wYXMNvePIBrShepn0VMgSgq7O5tRvSpdalM39OgZQQYKnBHYCwAAIAAAACAAAAAgAEAAAAFAAAAAAEBH4Dw+gIAAAAAFgAUl4qQRg5EZxpS9JoJu1nMZ5S2PIkiAgPj0kSjln4Lh3Zf2obF/ziIX3SZOVO5WEOIrvMLJq9q7EcwRAIgd5Ug2usK5Ycn3yV4VDzjKgYO107KhsRIIOUqzsQwE9ECIAl7CBVQYmK/lygnbbOqIng0..." /* TRUNCATED STRING LITERAL */
             ,pcVar5);
  std::__cxx11::string::~string(local_2d80);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2d60);
  if (!bVar2) {
    testing::Message::Message(&local_2d88);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x24b088);
    testing::internal::AssertHelper::AssertHelper
              (&local_2d90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x158,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2d90,&local_2d88);
    testing::internal::AssertHelper::~AssertHelper(&local_2d90);
    testing::Message::~Message((Message *)0x24b0eb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x24b140);
  bVar3 = cfd::core::Psbt::IsFinalized();
  local_2dc9 = ~bVar3 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_00,(bool *)pvVar11,(type *)0x24b3a5);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_2dc8);
  if (!bVar2) {
    testing::Message::Message(&local_2dd8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2e00,(internal *)local_2dc8,(AssertionResult *)"psbt.IsFinalized()","true",
               "false",(char *)expected_predicate_value);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2de0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x160,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2de0,&local_2dd8);
    testing::internal::AssertHelper::~AssertHelper(&local_2de0);
    std::__cxx11::string::~string((string *)&local_2e00);
    testing::Message::~Message((Message *)0x24b4aa);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x24b525);
  pvVar9 = std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[](&local_418,0);
  pvVar10 = std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[](&local_418,0);
  cfd::core::OutPoint::OutPoint(&local_2e28,(Txid *)(pvVar9 + 0x28),*(uint *)(pvVar10 + 0x48));
  bVar3 = cfd::Psbt::IsFinalizedInput((OutPoint *)&local_538);
  local_2e39 = ~bVar3 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_00,(bool *)pvVar11,(type *)0x24b5ca);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2e38);
  if (!bVar2) {
    testing::Message::Message(&local_2e48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2e70,(internal *)&local_2e38,
               (AssertionResult *)"psbt.IsFinalizedInput(outpoint1)","true","false",
               (char *)expected_predicate_value);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2e50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x162,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2e50,&local_2e48);
    testing::internal::AssertHelper::~AssertHelper(&local_2e50);
    std::__cxx11::string::~string((string *)&local_2e70);
    testing::Message::~Message((Message *)0x24b6e1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x24b75c);
  cfd::core::Psbt::Finalize();
  local_2e81 = cfd::Psbt::IsFinalizedInput((OutPoint *)&local_538);
  local_2e81 = local_2e81 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_00,(bool *)pvVar11,(type *)0x24b7b2);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2e80);
  if (!bVar2) {
    testing::Message::Message(&local_2e90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2eb8,(internal *)&local_2e80,
               (AssertionResult *)"psbt.IsFinalizedInput(outpoint1)","false","true",
               (char *)expected_predicate_value);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2e98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x164,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2e98,&local_2e90);
    testing::internal::AssertHelper::~AssertHelper(&local_2e98);
    std::__cxx11::string::~string((string *)&local_2eb8);
    testing::Message::~Message((Message *)0x24b8b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x24b92b);
  cfd::core::Psbt::GetData();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar5 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_2ec8,
             "\"70736274ff0100fd86010200000007f834da7cb5e183fc815f7846227284660fa4a0a583be2bfb4a535bf425e531de0100000000ffffffff5aef6a3bce7624951ae5b9e8c0908e8ff74721eedf7a0994d5bf1efc7dee82810200000000ffffffffa92dd64952789efd1444938e9ce5b106e7280089c4dc4a78b3da7c7a2b69d93f0300000000fffffffffcf72c7bb8881945955e48f54e6081b51901836484e5c48a9925061029c405d10400000000ffffffffa0be1a4d9a22c832d2d20a3a084f010d09a9ab41fb3e2dedbd46eb0104578fb90500000000ffffffff71a141bf5b653e2c43773305d69a8c9876944470ca1e29e4b03a0953c4beb6950100000000ffffffff3c427c95ec8ed79796f13d37d525fbe868545cd91a1eb0d89ff90980731f3a8b0700000000ffffffff0380f0fa0200000000160014b322bddce633b851ac7370ab454f0b367a0654e580f0fa0200000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a555f2919800000000001600142b6e16ba38e280500f80b2c5706ef02f38d59081000000000001011f8096980000000000160014962c4e08f336d3afbc3415c9d359ae104047052001086b02473044022016d6be246613d8f20a98f79651ba6402352478bde005ba292adee40c3060f97a022061e5e264be9a892f4579bcbcd5c660405d3b95adb807c8b54caf3dc22f75f9fd012102565248460b3c186decf13db06f0724fd50b47cc3e489c30076c8363d5038cefe0001011f80969800000000001600148bf09d60b7e34f34827d8dbcb1c76390a916ca8201086b024730440220622277094f292704dfbcd95c951b95f83f8ae85b0584d0a6058548a7a0ae814e02200b913ac3fcce9780911e927997442af8de0945f03a9576a2c300bdebe08c61820121022744cfb2436e156040ec1c8fe842d9ef9a18cb40ad41f312725390c35f7bd36b0001011f8096980000000000160014f1d3ee67829225eb892ccab01e22f6a777e7e21e01086b0247304402202dc3146d944ac124e6964730524e73b3600ce84ec4c286cbcccfe7eb25cfb2a30220701661116a179ce213c14280073253c3467ef8e8a7324618ac263e337046b3a6012102e7e8dc236fa024369408d2ce4d8508048261abc297b811604da087ad71d138550001011f809698000000000016001419d65f8328b2206d9970785660ec0d34808fb07501086b02473044022062b755ad1f11cd001bb9744788c4db87d90253d337f37048cb29529eacd854050220483bbc41077c7a31cbaf7dc02acad05e28e42d2a3224c99cfb31064fa21015b00121033d874bf19b697cf6c639659547a583b86730164a5b6db01bf20a14eb9b6adb440001011f809698000000000016001412b7954a75efc2a20e86e32dc2d78647d670077901086b02473044022..." /* TRUNCATED STRING LITERAL */
             ,"psbt.GetData().GetHex().c_str()",
             "70736274ff0100fd86010200000007f834da7cb5e183fc815f7846227284660fa4a0a583be2bfb4a535bf425e531de0100000000ffffffff5aef6a3bce7624951ae5b9e8c0908e8ff74721eedf7a0994d5bf1efc7dee82810200000000ffffffffa92dd64952789efd1444938e9ce5b106e7280089c4dc4a78b3da7c7a2b69d93f0300000000fffffffffcf72c7bb8881945955e48f54e6081b51901836484e5c48a9925061029c405d10400000000ffffffffa0be1a4d9a22c832d2d20a3a084f010d09a9ab41fb3e2dedbd46eb0104578fb90500000000ffffffff71a141bf5b653e2c43773305d69a8c9876944470ca1e29e4b03a0953c4beb6950100000000ffffffff3c427c95ec8ed79796f13d37d525fbe868545cd91a1eb0d89ff90980731f3a8b0700000000ffffffff0380f0fa0200000000160014b322bddce633b851ac7370ab454f0b367a0654e580f0fa0200000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a555f2919800000000001600142b6e16ba38e280500f80b2c5706ef02f38d59081000000000001011f8096980000000000160014962c4e08f336d3afbc3415c9d359ae104047052001086b02473044022016d6be246613d8f20a98f79651ba6402352478bde005ba292adee40c3060f97a022061e5e264be9a892f4579bcbcd5c660405d3b95adb807c8b54caf3dc22f75f9fd012102565248460b3c186decf13db06f0724fd50b47cc3e489c30076c8363d5038cefe0001011f80969800000000001600148bf09d60b7e34f34827d8dbcb1c76390a916ca8201086b024730440220622277094f292704dfbcd95c951b95f83f8ae85b0584d0a6058548a7a0ae814e02200b913ac3fcce9780911e927997442af8de0945f03a9576a2c300bdebe08c61820121022744cfb2436e156040ec1c8fe842d9ef9a18cb40ad41f312725390c35f7bd36b0001011f8096980000000000160014f1d3ee67829225eb892ccab01e22f6a777e7e21e01086b0247304402202dc3146d944ac124e6964730524e73b3600ce84ec4c286cbcccfe7eb25cfb2a30220701661116a179ce213c14280073253c3467ef8e8a7324618ac263e337046b3a6012102e7e8dc236fa024369408d2ce4d8508048261abc297b811604da087ad71d138550001011f809698000000000016001419d65f8328b2206d9970785660ec0d34808fb07501086b02473044022062b755ad1f11cd001bb9744788c4db87d90253d337f37048cb29529eacd854050220483bbc41077c7a31cbaf7dc02acad05e28e42d2a3224c99cfb31064fa21015b00121033d874bf19b697cf6c639659547a583b86730164a5b6db01bf20a14eb9b6adb440001011f809698000000000016001412b7954a75efc2a20e86e32dc2d78647d670077901086b024730440220..." /* TRUNCATED STRING LITERAL */
             ,pcVar5);
  std::__cxx11::string::~string(local_2ee8);
  cfd::core::ByteData::~ByteData((ByteData *)0x24b9a7);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2ec8);
  if (!bVar2) {
    testing::Message::Message(local_2f08);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x24ba5f);
    testing::internal::AssertHelper::AssertHelper
              (&local_2f10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x165,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2f10,local_2f08);
    testing::internal::AssertHelper::~AssertHelper(&local_2f10);
    testing::Message::~Message((Message *)0x24bac2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x24bb17);
  cfd::Psbt::Verify();
  cfd::core::OutPoint::~OutPoint((OutPoint *)0x24bb33);
  local_2f49 = cfd::core::Psbt::IsFinalized();
  local_2f49 = local_2f49 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_00,(bool *)pvVar11,(type *)0x24bda3);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_2f48);
  if (!bVar2) {
    testing::Message::Message(&local_2f58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2f80,(internal *)local_2f48,(AssertionResult *)"psbt.IsFinalized()","false",
               "true",(char *)expected_predicate_value);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2f60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x16f,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2f60,&local_2f58);
    testing::internal::AssertHelper::~AssertHelper(&local_2f60);
    std::__cxx11::string::~string((string *)&local_2f80);
    testing::Message::~Message((Message *)0x24bea8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x24bf23);
  local_2fb8 = cfd::Psbt::GetFeeAmount();
  local_2fb0 = extraout_DL;
  local_2fa8 = local_2fb8;
  local_2fa0 = extraout_DL;
  local_2f98 = cfd::core::Amount::GetSatoshiValue();
  local_2fbc = 0x48e;
  testing::internal::EqHelper<false>::Compare<long,int>
            ((char *)in_stack_ffffffffffffba18.container,(char *)in_stack_ffffffffffffba10,
             (long *)in_stack_ffffffffffffba08,(int *)this_00);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2f90);
  if (!bVar2) {
    testing::Message::Message(&local_2fc8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x24c04b);
    testing::internal::AssertHelper::AssertHelper
              (&local_2fd0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x170,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2fd0,&local_2fc8);
    testing::internal::AssertHelper::~AssertHelper(&local_2fd0);
    testing::Message::~Message((Message *)0x24c0ae);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x24c106);
  cfd::core::Psbt::ExtractTransaction();
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  pcVar5 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_3020,
             "\"02000000000107f834da7cb5e183fc815f7846227284660fa4a0a583be2bfb4a535bf425e531de0100000000ffffffff5aef6a3bce7624951ae5b9e8c0908e8ff74721eedf7a0994d5bf1efc7dee82810200000000ffffffffa92dd64952789efd1444938e9ce5b106e7280089c4dc4a78b3da7c7a2b69d93f0300000000fffffffffcf72c7bb8881945955e48f54e6081b51901836484e5c48a9925061029c405d10400000000ffffffffa0be1a4d9a22c832d2d20a3a084f010d09a9ab41fb3e2dedbd46eb0104578fb90500000000ffffffff71a141bf5b653e2c43773305d69a8c9876944470ca1e29e4b03a0953c4beb6950100000000ffffffff3c427c95ec8ed79796f13d37d525fbe868545cd91a1eb0d89ff90980731f3a8b0700000000ffffffff0380f0fa0200000000160014b322bddce633b851ac7370ab454f0b367a0654e580f0fa0200000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a555f2919800000000001600142b6e16ba38e280500f80b2c5706ef02f38d5908102473044022016d6be246613d8f20a98f79651ba6402352478bde005ba292adee40c3060f97a022061e5e264be9a892f4579bcbcd5c660405d3b95adb807c8b54caf3dc22f75f9fd012102565248460b3c186decf13db06f0724fd50b47cc3e489c30076c8363d5038cefe024730440220622277094f292704dfbcd95c951b95f83f8ae85b0584d0a6058548a7a0ae814e02200b913ac3fcce9780911e927997442af8de0945f03a9576a2c300bdebe08c61820121022744cfb2436e156040ec1c8fe842d9ef9a18cb40ad41f312725390c35f7bd36b0247304402202dc3146d944ac124e6964730524e73b3600ce84ec4c286cbcccfe7eb25cfb2a30220701661116a179ce213c14280073253c3467ef8e8a7324618ac263e337046b3a6012102e7e8dc236fa024369408d2ce4d8508048261abc297b811604da087ad71d1385502473044022062b755ad1f11cd001bb9744788c4db87d90253d337f37048cb29529eacd854050220483bbc41077c7a31cbaf7dc02acad05e28e42d2a3224c99cfb31064fa21015b00121033d874bf19b697cf6c639659547a583b86730164a5b6db01bf20a14eb9b6adb4402473044022065ef50669cb7804a837b11c727f8a4891de3b408544c5b817fed41b3a2cdbd67022046b380b373c2368ffdce73a9b2b0f634ef83915aea9e677133caeae861a24f88012102fb061730dbde3c806b4a17a99f454c81282aecee6d46f4a975a94cdfd3a06504024730440220779520daeb0ae58727df2578543ce32a060ed74eca86c44820e52acec43013d10220097b0815506262bf9728276db3aa227834959187455dc3f191f9fe80aa309552012103e3d244a3967e0b87765fda86c5ff38885f74993953b9584388a..." /* TRUNCATED STRING LITERAL */
             ,"tx.GetHex().c_str()",
             "02000000000107f834da7cb5e183fc815f7846227284660fa4a0a583be2bfb4a535bf425e531de0100000000ffffffff5aef6a3bce7624951ae5b9e8c0908e8ff74721eedf7a0994d5bf1efc7dee82810200000000ffffffffa92dd64952789efd1444938e9ce5b106e7280089c4dc4a78b3da7c7a2b69d93f0300000000fffffffffcf72c7bb8881945955e48f54e6081b51901836484e5c48a9925061029c405d10400000000ffffffffa0be1a4d9a22c832d2d20a3a084f010d09a9ab41fb3e2dedbd46eb0104578fb90500000000ffffffff71a141bf5b653e2c43773305d69a8c9876944470ca1e29e4b03a0953c4beb6950100000000ffffffff3c427c95ec8ed79796f13d37d525fbe868545cd91a1eb0d89ff90980731f3a8b0700000000ffffffff0380f0fa0200000000160014b322bddce633b851ac7370ab454f0b367a0654e580f0fa0200000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a555f2919800000000001600142b6e16ba38e280500f80b2c5706ef02f38d5908102473044022016d6be246613d8f20a98f79651ba6402352478bde005ba292adee40c3060f97a022061e5e264be9a892f4579bcbcd5c660405d3b95adb807c8b54caf3dc22f75f9fd012102565248460b3c186decf13db06f0724fd50b47cc3e489c30076c8363d5038cefe024730440220622277094f292704dfbcd95c951b95f83f8ae85b0584d0a6058548a7a0ae814e02200b913ac3fcce9780911e927997442af8de0945f03a9576a2c300bdebe08c61820121022744cfb2436e156040ec1c8fe842d9ef9a18cb40ad41f312725390c35f7bd36b0247304402202dc3146d944ac124e6964730524e73b3600ce84ec4c286cbcccfe7eb25cfb2a30220701661116a179ce213c14280073253c3467ef8e8a7324618ac263e337046b3a6012102e7e8dc236fa024369408d2ce4d8508048261abc297b811604da087ad71d1385502473044022062b755ad1f11cd001bb9744788c4db87d90253d337f37048cb29529eacd854050220483bbc41077c7a31cbaf7dc02acad05e28e42d2a3224c99cfb31064fa21015b00121033d874bf19b697cf6c639659547a583b86730164a5b6db01bf20a14eb9b6adb4402473044022065ef50669cb7804a837b11c727f8a4891de3b408544c5b817fed41b3a2cdbd67022046b380b373c2368ffdce73a9b2b0f634ef83915aea9e677133caeae861a24f88012102fb061730dbde3c806b4a17a99f454c81282aecee6d46f4a975a94cdfd3a06504024730440220779520daeb0ae58727df2578543ce32a060ed74eca86c44820e52acec43013d10220097b0815506262bf9728276db3aa227834959187455dc3f191f9fe80aa309552012103e3d244a3967e0b87765fda86c5ff38885f74993953b9584388ae..." /* TRUNCATED STRING LITERAL */
             ,pcVar5);
  std::__cxx11::string::~string(local_3040);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_3020);
  if (!bVar2) {
    testing::Message::Message(&local_3048);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x24c223);
    testing::internal::AssertHelper::AssertHelper
              (&local_3050,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x172,pcVar5);
    testing::internal::AssertHelper::operator=(&local_3050,&local_3048);
    testing::internal::AssertHelper::~AssertHelper(&local_3050);
    testing::Message::~Message((Message *)0x24c286);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x24c2de);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  cfd::TransactionContext::TransactionContext(local_3108,local_3128);
  std::__cxx11::string::~string(local_3128);
  cfd::Psbt::GetUtxoDataAll((NetType)&local_3140);
  local_3154 = 10000000;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[](&local_3140,0);
  local_3160 = cfd::core::Amount::GetSatoshiValue();
  testing::internal::EqHelper<false>::Compare<int,long>
            ((char *)in_stack_ffffffffffffba18.container,(char *)in_stack_ffffffffffffba10,
             (int *)in_stack_ffffffffffffba08,(long *)this_00);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_3150);
  if (!bVar2) {
    testing::Message::Message(&local_3168);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x24c462);
    testing::internal::AssertHelper::AssertHelper
              (&local_3170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x176,pcVar5);
    testing::internal::AssertHelper::operator=(&local_3170,&local_3168);
    testing::internal::AssertHelper::~AssertHelper(&local_3170);
    testing::Message::~Message((Message *)0x24c4bf);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x24c517);
  local_3184 = 10000000;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[](&local_3140,4);
  local_3190 = cfd::core::Amount::GetSatoshiValue();
  testing::internal::EqHelper<false>::Compare<int,long>
            ((char *)in_stack_ffffffffffffba18.container,(char *)in_stack_ffffffffffffba10,
             (int *)in_stack_ffffffffffffba08,(long *)this_00);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_3180);
  if (!bVar2) {
    testing::Message::Message(&local_3198);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x24c5ed);
    testing::internal::AssertHelper::AssertHelper
              (&local_31a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x177,pcVar5);
    testing::internal::AssertHelper::operator=(&local_31a0,&local_3198);
    testing::internal::AssertHelper::~AssertHelper(&local_31a0);
    testing::Message::~Message((Message *)0x24c64a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x24c6a2);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[](&local_3140,4);
  cfd::core::Txid::GetHex_abi_cxx11_();
  pcVar5 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_31b0,
             "\"b98f570401eb46bded2d3efb41aba9090d014f083a0ad2d232c8229a4d1abea0\"",
             "utxos[4].txid.GetHex().c_str()",
             "b98f570401eb46bded2d3efb41aba9090d014f083a0ad2d232c8229a4d1abea0",pcVar5);
  std::__cxx11::string::~string(local_31d0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_31b0);
  if (!bVar2) {
    testing::Message::Message(&local_31d8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x24c79a);
    testing::internal::AssertHelper::AssertHelper
              (&local_31e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x178,pcVar5);
    testing::internal::AssertHelper::operator=(&local_31e0,&local_31d8);
    testing::internal::AssertHelper::~AssertHelper(&local_31e0);
    testing::Message::~Message((Message *)0x24c7f7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x24c84f);
  pvVar9 = std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[](&local_3140,0);
  cfd::UtxoData::UtxoData(local_36d0,pvVar9);
  pvVar9 = std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[](&local_3140,4);
  cfd::UtxoData::UtxoData(local_3bc0,pvVar9);
  pvVar9 = std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[](&local_3140,5);
  cfd::UtxoData::UtxoData(local_40b0,pvVar9);
  cfd::TransactionContext::CollectInputUtxo((vector *)local_3108);
  cfd::TransactionContext::Verify();
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_4100,"76a914962c4e08f336d3afbc3415c9d359ae104047052088ac",&local_4101);
  cfd::core::ByteData::ByteData(&local_40e0,local_4100);
  cfd::core::SigHashType::SigHashType(local_4110);
  uVar12 = 0;
  pvVar9 = std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[](&local_3140,0);
  cfd::core::Transaction::GetSignatureHash
            (local_40c8,local_3108,uVar12,&local_40e0,local_4110,pvVar9 + 600,
             (ulong)pvVar11 & 0xffffffff00000000);
  cfd::core::ByteData::~ByteData((ByteData *)0x24c993);
  std::__cxx11::string::~string(local_4100);
  std::allocator<char>::~allocator((allocator<char> *)&local_4101);
  cfd::core::ByteData256::GetHex_abi_cxx11_();
  pcVar5 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_4120,
             "\"b330738168b0df580797fa0e5eba6287b16f7b881df208c7045008f0d193e2c1\"",
             "sighash.GetHex().c_str()",
             "b330738168b0df580797fa0e5eba6287b16f7b881df208c7045008f0d193e2c1",pcVar5);
  std::__cxx11::string::~string(local_4140);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_4120);
  if (!bVar2) {
    testing::Message::Message(&local_4148);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x24cb67);
    testing::internal::AssertHelper::AssertHelper
              (&local_4150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x183,pcVar5);
    testing::internal::AssertHelper::operator=(&local_4150,&local_4148);
    testing::internal::AssertHelper::~AssertHelper(&local_4150);
    testing::Message::~Message((Message *)0x24cbc4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x24cc19);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)0x24cc26);
  cfd::UtxoData::~UtxoData((UtxoData *)this_00);
  cfd::UtxoData::~UtxoData((UtxoData *)this_00);
  cfd::UtxoData::~UtxoData((UtxoData *)this_00);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(in_stack_ffffffffffffba10);
  cfd::TransactionContext::~TransactionContext((TransactionContext *)this_00);
  cfd::core::Transaction::~Transaction((Transaction *)this_00);
  std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>::~vector
            ((vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> *)
             in_stack_ffffffffffffba10);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(in_stack_ffffffffffffba10);
  cfd::Psbt::~Psbt((Psbt *)this_00);
  cfd::Psbt::~Psbt((Psbt *)this_00);
  cfd::core::Address::~Address((Address *)this_00);
  cfd::core::Address::~Address((Address *)this_00);
  cfd::core::KeyData::~KeyData(this_00);
  cfd::core::KeyData::~KeyData(this_00);
  std::__cxx11::string::~string(local_580);
  std::__cxx11::string::~string(local_558);
  cfd::Psbt::~Psbt((Psbt *)this_00);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(in_stack_ffffffffffffba10);
  std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>::~vector
            ((vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> *)
             in_stack_ffffffffffffba10);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(in_stack_ffffffffffffba10);
  std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>::~vector
            ((vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> *)
             in_stack_ffffffffffffba10);
  cfd::core::Descriptor::~Descriptor((Descriptor *)0x24cfae);
  std::__cxx11::string::~string((string *)local_220);
  cfd::core::KeyData::~KeyData(this_00);
  std::__cxx11::string::~string(local_a8);
  cfd::core::HDWallet::~HDWallet((HDWallet *)0x24cfe2);
  cfd::core::HDWallet::~HDWallet((HDWallet *)0x24cfef);
  return;
}

Assistant:

TEST(Psbt, UsecaseTest2) {
  static const std::string seed1 = "8bc106907003ea0b55f3ed4ce2fcf9a198d8c43f07e6ade8aacc5c20c33db12e";
  static const std::string seed2 = "d3e3539eafb6af1f0ae374ecffd33bed394f5eb2e39f8957be63c258ac32ca97";

  NetType net_type = NetType::kRegtest;
  HDWallet wallet1 = HDWallet(ByteData(g_psbt_seed1));
  HDWallet wallet2 = HDWallet(ByteData(g_psbt_seed2));
  std::string path1 = "44h/0h/0h/1/100";
  auto change_key1 = wallet1.GeneratePubkeyData(net_type, path1);
  std::string change_descriptor1 = "wpkh(" + change_key1.ToString() + ")";
  Descriptor change_desc1 = Descriptor::Parse(change_descriptor1);
  EXPECT_STREQ("wpkh([2a704760/44'/0'/0'/1/100]02f7f0d7d00289b7c5a581bc35276040c348de48fc414067f31ea26ad95c00550c)", change_descriptor1.c_str());

  std::vector<Privkey> privkey_list1;
  auto utxo_list1 = CfdTestGenerateUtxo(
    net_type, wallet1, "44h/0h/0h/1", Amount(10000000), 1, 11, &privkey_list1);
  std::vector<Privkey> privkey_list2;
  auto utxo_list2 = CfdTestGenerateUtxo(
    net_type, wallet2, "44h/0h/0h/1", Amount(50000000), 1, 3, &privkey_list2);

  Psbt psbt;
  std::string out_path1 = "44h/0h/0h/0/2";
  std::string out_path2 = "44h/0h/0h/0/2";
  auto out_key1 = wallet1.GeneratePubkeyData(net_type, out_path1);
  auto out_key2 = wallet2.GeneratePubkeyData(net_type, out_path2);
  auto out_addr1 = Address(NetType::kTestnet, WitnessVersion::kVersion0, out_key1.GetPubkey());
  auto out_addr2 = Address(NetType::kTestnet, WitnessVersion::kVersion0, out_key2.GetPubkey());

  // Creator
  // add txout (0.5btc * 2)
  Amount amount(50000000);
  try {
    psbt.AddTxOutData(amount, out_addr1, out_key1);
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }
  try {
    psbt.AddTxOutData(amount, out_addr2, out_key2);
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }

  // Updater
  // add txin
  Psbt psbt1;
  Psbt psbt2;
  uint32_t use_utxo1_count = 5;
  try {
    psbt1 = psbt;
    for (uint32_t index=0; index<use_utxo1_count; ++index) {
      psbt1.AddTxInData(utxo_list1[index]);
    }
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  try {
    psbt2 = psbt;
    psbt2.AddTxInData(utxo_list2[0]);
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  try {
    psbt.Join(psbt1);
    EXPECT_EQ(5, psbt.GetTxInCount());
    EXPECT_EQ(10000000, psbt.GetUtxoData(0).amount.GetSatoshiValue());
    EXPECT_EQ(10000000, psbt.GetUtxoData(4).amount.GetSatoshiValue());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }
  try {
    psbt.Join(psbt2);
    EXPECT_EQ(50000000, psbt.GetUtxoData(5).amount.GetSatoshiValue());
    EXPECT_EQ(utxo_list2[0].amount.GetSatoshiValue(), psbt.GetUtxoData(5).amount.GetSatoshiValue());
    EXPECT_EQ(utxo_list2[0].txid.GetHex(), psbt.GetUtxoData(5).txid.GetHex());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  // 70736274ff0100fd3e010200000006f834da7cb5e183fc815f7846227284660fa4a0a583be2bfb4a535bf425e531de0100000000ffffffff5aef6a3bce7624951ae5b9e8c0908e8ff74721eedf7a0994d5bf1efc7dee82810200000000ffffffffa92dd64952789efd1444938e9ce5b106e7280089c4dc4a78b3da7c7a2b69d93f0300000000fffffffffcf72c7bb8881945955e48f54e6081b51901836484e5c48a9925061029c405d10400000000ffffffffa0be1a4d9a22c832d2d20a3a084f010d09a9ab41fb3e2dedbd46eb0104578fb90500000000ffffffff71a141bf5b653e2c43773305d69a8c9876944470ca1e29e4b03a0953c4beb6950100000000ffffffff0280f0fa0200000000160014b322bddce633b851ac7370ab454f0b367a0654e580f0fa0200000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a555000000000001011f8096980000000000160014962c4e08f336d3afbc3415c9d359ae1040470520220602565248460b3c186decf13db06f0724fd50b47cc3e489c30076c8363d5038cefe182a7047602c000080000000800000008001000000010000000001011f80969800000000001600148bf09d60b7e34f34827d8dbcb1c76390a916ca822206022744cfb2436e156040ec1c8fe842d9ef9a18cb40ad41f312725390c35f7bd36b182a7047602c000080000000800000008001000000020000000001011f8096980000000000160014f1d3ee67829225eb892ccab01e22f6a777e7e21e220602e7e8dc236fa024369408d2ce4d8508048261abc297b811604da087ad71d13855182a7047602c000080000000800000008001000000030000000001011f809698000000000016001419d65f8328b2206d9970785660ec0d34808fb0752206033d874bf19b697cf6c639659547a583b86730164a5b6db01bf20a14eb9b6adb44182a7047602c000080000000800000008001000000040000000001011f809698000000000016001412b7954a75efc2a20e86e32dc2d78647d6700779220602fb061730dbde3c806b4a17a99f454c81282aecee6d46f4a975a94cdfd3a06504182a7047602c000080000000800000008001000000050000000001011f80f0fa0200000000160014978a90460e44671a52f49a09bb59cc6794b63c89220603e3d244a3967e0b87765fda86c5ff38885f74993953b9584388aef30b26af6aec189d6b6d862c0000800000008000000080010000000100000000220203473bfc8c770c1b220a2e7aae4badf6c0d7eaf29028d5b29d3438012bb289ef81182a7047602c00008000000080000000800000000002000000002202036474aff2633c351865539fb52b62b9d6fb9e4e23576628e1f0a0a7993458e06c189d6b6d862c0000800000008000000080000000000200000000
  EXPECT_STREQ("cHNidP8BAP0+AQIAAAAG+DTafLXhg/yBX3hGInKEZg+koKWDviv7SlNb9CXlMd4BAAAAAP////9a72o7znYklRrluejAkI6P90ch7t96CZTVvx78fe6CgQIAAAAA/////6kt1klSeJ79FESTjpzlsQbnKACJxNxKeLPafHoradk/AwAAAAD//////Pcse7iIGUWVXkj1TmCBtRkBg2SE5cSKmSUGECnEBdEEAAAAAP////+gvhpNmiLIMtLSCjoITwENCamrQfs+Le29RusBBFePuQUAAAAA/////3GhQb9bZT4sQ3czBdaajJh2lERwyh4p5LA6CVPEvraVAQAAAAD/////AoDw+gIAAAAAFgAUsyK93OYzuFGsc3CrRU8LNnoGVOWA8PoCAAAAABYAFMq4xTpuj8ApbRzTkVowfVHEkaVVAAAAAAABAR+AlpgAAAAAABYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgYCVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv4YKnBHYCwAAIAAAACAAAAAgAEAAAABAAAAAAEBH4CWmAAAAAAAFgAUi/CdYLfjTzSCfY28scdjkKkWyoIiBgInRM+yQ24VYEDsHI/oQtnvmhjLQK1B8xJyU5DDX3vTaxgqcEdgLAAAgAAAAIAAAACAAQAAAAIAAAAAAQEfgJaYAAAAAAAWABTx0+5ngpIl64ksyrAeIvand+fiHiIGAufo3CNvoCQ2lAjSzk2FCASCYavCl7gRYE2gh61x0ThVGCpwR2AsAACAAAAAgAAAAIABAAAAAwAAAAABAR+AlpgAAAAAABYAFBnWX4MosiBtmXB4VmDsDTSAj7B1IgYDPYdL8ZtpfPbGOWWVR6WDuGcwFkpbbbAb8goU65tq20QYKnBHYCwAAIAAAACAAAAAgAEAAAAEAAAAAAEBH4CWmAAAAAAAFgAUEreVSnXvwqIOhuMtwteGR9ZwB3kiBgL7Bhcw2948gGtKF6mfRUyBKCrs7m1G9Kl1qUzf06BlBBgqcEdgLAAAgAAAAIAAAACAAQAAAAUAAAAAAQEfgPD6AgAAAAAWABSXipBGDkRnGlL0mgm7WcxnlLY8iSIGA+PSRKOWfguHdl/ahsX/OIhfdJk5U7lYQ4iu8wsmr2rsGJ1rbYYsAACAAAAAgAAAAIABAAAAAQAAAAAiAgNHO/yMdwwbIgoueq5LrfbA1+rykCjVsp00OAErsonvgRgqcEdgLAAAgAAAAIAAAACAAAAAAAIAAAAAIgIDZHSv8mM8NRhlU5+1K2K51vueTiNXZijh8KCnmTRY4GwYnWtthiwAAIAAAACAAAAAgAAAAAACAAAAAA==", psbt.GetBase64().c_str());

  // Updater (for fee)
  std::vector<UtxoData> selected_utxos;
  std::vector<Privkey> target_privkey_list1;
  try {
    Amount fee;
    std::vector<UtxoData> selection_utxo;
    std::copy(utxo_list1.begin() + use_utxo1_count + 1, utxo_list1.end(),
        std::back_inserter(selection_utxo));
    CoinSelectionOption option;
    option.SetEffectiveFeeBaserate(2.0);
    option.SetKnapsackMinimumChange(0);
    EXPECT_EQ(5, selection_utxo.size());
    EXPECT_EQ(10000000, selection_utxo[0].amount.GetSatoshiValue());
    EXPECT_EQ(6, psbt.GetTxInCount());

    EXPECT_STREQ("8b3a1f738009f99fd8b01e1ad95c5468e8fb25d5373df19697d78eec957c423c", selection_utxo[0].txid.GetHex().c_str());
    EXPECT_EQ(7, selection_utxo[0].vout);
    EXPECT_STREQ("wpkh([2a704760/44'/0'/0'/1/7]03c02325c328fed622a9d88f8f5318e05261a3c3a967b7211d7d67657e2b5e9fbe)", selection_utxo[0].descriptor.c_str());
    EXPECT_STREQ("0e5b0e16148da878ee8d9f0524ac0962a22dbbb66e2dc8a6237a1d4c8c4ea9cb", selection_utxo[1].txid.GetHex().c_str());
    EXPECT_EQ(8, selection_utxo[1].vout);
    EXPECT_STREQ("wpkh([2a704760/44'/0'/0'/1/8]02f505e0b5885959bd2f7e68dd73915940a5540e05c41a42f6c598ceb21bdc55f3)", selection_utxo[1].descriptor.c_str());
    EXPECT_STREQ("016b36a0a9df54d55f7b907aba8fdd3d90d797eee2bc46c5ed7dced41218e674", selection_utxo[2].txid.GetHex().c_str());
    EXPECT_EQ(9, selection_utxo[2].vout);
    EXPECT_STREQ("wpkh([2a704760/44'/0'/0'/1/9]02f7af7e1c3c8627e0e662ba04ec003879d9aeaeba5a02a1e24804ef4d7b497db4)", selection_utxo[2].descriptor.c_str());
    EXPECT_STREQ("dcc65ebfb8535f96f8a51e07d5c0a94f965000bd5765159a3cc27e4edd658c69", selection_utxo[3].txid.GetHex().c_str());
    EXPECT_EQ(10, selection_utxo[3].vout);
    EXPECT_STREQ("wpkh([2a704760/44'/0'/0'/1/10]03c04e76f9bc7d6433a6eb7c0c3c446213c5f361dae22929483f23718e1cee4ece)", selection_utxo[3].descriptor.c_str());
    EXPECT_STREQ("0230e7471501f9432f727583f2bc17c11f5c1132140319ba2d7a5a0145684c73", selection_utxo[4].txid.GetHex().c_str());
    EXPECT_EQ(11, selection_utxo[4].vout);
    EXPECT_STREQ("wpkh([2a704760/44'/0'/0'/1/11]03798ff13e5d17c6f8c1d69ff18d516613be2fa52149b3a8c60ef959d1075a5889)", selection_utxo[4].descriptor.c_str());

    selected_utxos = psbt.FundTransaction(selection_utxo, 2.0,
        &change_desc1, &fee, &option);
    EXPECT_EQ(fee.GetSatoshiValue(), 1166);
    
    for (uint32_t index=0; index<use_utxo1_count; ++index) {
      target_privkey_list1.push_back(privkey_list1[index]);
    }
    for (const auto& select_utxo : selected_utxos) {
      for (size_t index=use_utxo1_count; index<utxo_list1.size(); ++index) {
        if ((select_utxo.vout == utxo_list1[index].vout) &&
            select_utxo.txid.Equals(utxo_list1[index].txid)) {
          target_privkey_list1.push_back(privkey_list1[index]);
        }
      }
    }
    EXPECT_STREQ("cHNidP8BAP2GAQIAAAAH+DTafLXhg/yBX3hGInKEZg+koKWDviv7SlNb9CXlMd4BAAAAAP////9a72o7znYklRrluejAkI6P90ch7t96CZTVvx78fe6CgQIAAAAA/////6kt1klSeJ79FESTjpzlsQbnKACJxNxKeLPafHoradk/AwAAAAD//////Pcse7iIGUWVXkj1TmCBtRkBg2SE5cSKmSUGECnEBdEEAAAAAP////+gvhpNmiLIMtLSCjoITwENCamrQfs+Le29RusBBFePuQUAAAAA/////3GhQb9bZT4sQ3czBdaajJh2lERwyh4p5LA6CVPEvraVAQAAAAD/////PEJ8leyO15eW8T031SX76GhUXNkaHrDYn/kJgHMfOosHAAAAAP////8DgPD6AgAAAAAWABSzIr3c5jO4UaxzcKtFTws2egZU5YDw+gIAAAAAFgAUyrjFOm6PwCltHNORWjB9UcSRpVXykZgAAAAAABYAFCtuFro44oBQD4CyxXBu8C841ZCBAAAAAAABAR+AlpgAAAAAABYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgYCVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv4YKnBHYCwAAIAAAACAAAAAgAEAAAABAAAAAAEBH4CWmAAAAAAAFgAUi/CdYLfjTzSCfY28scdjkKkWyoIiBgInRM+yQ24VYEDsHI/oQtnvmhjLQK1B8xJyU5DDX3vTaxgqcEdgLAAAgAAAAIAAAACAAQAAAAIAAAAAAQEfgJaYAAAAAAAWABTx0+5ngpIl64ksyrAeIvand+fiHiIGAufo3CNvoCQ2lAjSzk2FCASCYavCl7gRYE2gh61x0ThVGCpwR2AsAACAAAAAgAAAAIABAAAAAwAAAAABAR+AlpgAAAAAABYAFBnWX4MosiBtmXB4VmDsDTSAj7B1IgYDPYdL8ZtpfPbGOWWVR6WDuGcwFkpbbbAb8goU65tq20QYKnBHYCwAAIAAAACAAAAAgAEAAAAEAAAAAAEBH4CWmAAAAAAAFgAUEreVSnXvwqIOhuMtwteGR9ZwB3kiBgL7Bhcw2948gGtKF6mfRUyBKCrs7m1G9Kl1qUzf06BlBBgqcEdgLAAAgAAAAIAAAACAAQAAAAUAAAAAAQEfgPD6AgAAAAAWABSXipBGDkRnGlL0mgm7WcxnlLY8iSIGA+PSRKOWfguHdl/ahsX/OIhfdJk5U7lYQ4iu8wsmr2rsGJ1rbYYsAACAAAAAgAAAAIABAAAAAQAAAAABAR+AlpgAAAAAABYAFBzoeOOg2js0MIeX/ey3YiH4VBivIgYDwCMlwyj+1iKp2I+PUxjgUmGjw6lntyEdfWdlfiten74YKnBHYCwAAIAAAACAAAAAgAEAAAAHAAAAACICA0c7/Ix3DBsiCi56rkut9sDX6vKQKNWynTQ4ASuyie+BGCpwR2AsAACAAAAAgAAAAIAAAAAAAgAAAAAiAgNkdK/yYzw1GGVTn7UrYrnW+55OI1dmKOHwoKeZNFjgbBida22GLAAAgAAAAIAAAACAAAAAAAIAAAAAIgIC9/DX0AKJt8Wlgbw1J2BAw0jeSPxBQGfzHqJq2VwAVQwYKnBHYCwAAIAAAACAAAAAgAEAAABkAAAAAA==", psbt.GetBase64().c_str());

  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  // Signer
  try {
    psbt1 = psbt;
    for (const auto& privkey : privkey_list1) {
      psbt1.Sign(privkey);
    }
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }
  try {
    psbt2 = psbt;
    psbt2.Sign(privkey_list2[0]);
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  // Combiner
  try {
    psbt.Combine(psbt1);
    psbt.Combine(psbt2);
    EXPECT_STREQ("70736274ff0100fd86010200000007f834da7cb5e183fc815f7846227284660fa4a0a583be2bfb4a535bf425e531de0100000000ffffffff5aef6a3bce7624951ae5b9e8c0908e8ff74721eedf7a0994d5bf1efc7dee82810200000000ffffffffa92dd64952789efd1444938e9ce5b106e7280089c4dc4a78b3da7c7a2b69d93f0300000000fffffffffcf72c7bb8881945955e48f54e6081b51901836484e5c48a9925061029c405d10400000000ffffffffa0be1a4d9a22c832d2d20a3a084f010d09a9ab41fb3e2dedbd46eb0104578fb90500000000ffffffff71a141bf5b653e2c43773305d69a8c9876944470ca1e29e4b03a0953c4beb6950100000000ffffffff3c427c95ec8ed79796f13d37d525fbe868545cd91a1eb0d89ff90980731f3a8b0700000000ffffffff0380f0fa0200000000160014b322bddce633b851ac7370ab454f0b367a0654e580f0fa0200000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a555f2919800000000001600142b6e16ba38e280500f80b2c5706ef02f38d59081000000000001011f8096980000000000160014962c4e08f336d3afbc3415c9d359ae1040470520220202565248460b3c186decf13db06f0724fd50b47cc3e489c30076c8363d5038cefe473044022016d6be246613d8f20a98f79651ba6402352478bde005ba292adee40c3060f97a022061e5e264be9a892f4579bcbcd5c660405d3b95adb807c8b54caf3dc22f75f9fd01220602565248460b3c186decf13db06f0724fd50b47cc3e489c30076c8363d5038cefe182a7047602c000080000000800000008001000000010000000001011f80969800000000001600148bf09d60b7e34f34827d8dbcb1c76390a916ca822202022744cfb2436e156040ec1c8fe842d9ef9a18cb40ad41f312725390c35f7bd36b4730440220622277094f292704dfbcd95c951b95f83f8ae85b0584d0a6058548a7a0ae814e02200b913ac3fcce9780911e927997442af8de0945f03a9576a2c300bdebe08c6182012206022744cfb2436e156040ec1c8fe842d9ef9a18cb40ad41f312725390c35f7bd36b182a7047602c000080000000800000008001000000020000000001011f8096980000000000160014f1d3ee67829225eb892ccab01e22f6a777e7e21e220202e7e8dc236fa024369408d2ce4d8508048261abc297b811604da087ad71d1385547304402202dc3146d944ac124e6964730524e73b3600ce84ec4c286cbcccfe7eb25cfb2a30220701661116a179ce213c14280073253c3467ef8e8a7324618ac263e337046b3a601220602e7e8dc236fa024369408d2ce4d8508048261abc297b811604da087ad71d13855182a7047602c000080000000800000008001000000030000000001011f809698000000000016001419d65f8328b2206d9970785660ec0d34808fb0752202033d874bf19b697cf6c639659547a583b86730164a5b6db01bf20a14eb9b6adb44473044022062b755ad1f11cd001bb9744788c4db87d90253d337f37048cb29529eacd854050220483bbc41077c7a31cbaf7dc02acad05e28e42d2a3224c99cfb31064fa21015b0012206033d874bf19b697cf6c639659547a583b86730164a5b6db01bf20a14eb9b6adb44182a7047602c000080000000800000008001000000040000000001011f809698000000000016001412b7954a75efc2a20e86e32dc2d78647d6700779220202fb061730dbde3c806b4a17a99f454c81282aecee6d46f4a975a94cdfd3a06504473044022065ef50669cb7804a837b11c727f8a4891de3b408544c5b817fed41b3a2cdbd67022046b380b373c2368ffdce73a9b2b0f634ef83915aea9e677133caeae861a24f8801220602fb061730dbde3c806b4a17a99f454c81282aecee6d46f4a975a94cdfd3a06504182a7047602c000080000000800000008001000000050000000001011f80f0fa0200000000160014978a90460e44671a52f49a09bb59cc6794b63c89220203e3d244a3967e0b87765fda86c5ff38885f74993953b9584388aef30b26af6aec4730440220779520daeb0ae58727df2578543ce32a060ed74eca86c44820e52acec43013d10220097b0815506262bf9728276db3aa227834959187455dc3f191f9fe80aa30955201220603e3d244a3967e0b87765fda86c5ff38885f74993953b9584388aef30b26af6aec189d6b6d862c000080000000800000008001000000010000000001011f80969800000000001600141ce878e3a0da3b34308797fdecb76221f85418af220203c02325c328fed622a9d88f8f5318e05261a3c3a967b7211d7d67657e2b5e9fbe47304402200fd024910c6207d2679ad1b9bb0ed8c0ff8d55aa603ef7c499917da20a3f417a0220086dfa0cce871385e24da90b7e20f5f1e1f9f7d707c5562bcfa66a855d7d220801220603c02325c328fed622a9d88f8f5318e05261a3c3a967b7211d7d67657e2b5e9fbe182a7047602c0000800000008000000080010000000700000000220203473bfc8c770c1b220a2e7aae4badf6c0d7eaf29028d5b29d3438012bb289ef81182a7047602c00008000000080000000800000000002000000002202036474aff2633c351865539fb52b62b9d6fb9e4e23576628e1f0a0a7993458e06c189d6b6d862c0000800000008000000080000000000200000000220202f7f0d7d00289b7c5a581bc35276040c348de48fc414067f31ea26ad95c00550c182a7047602c0000800000008000000080010000006400000000", psbt.GetData().GetHex().c_str());
    EXPECT_STREQ("cHNidP8BAP2GAQIAAAAH+DTafLXhg/yBX3hGInKEZg+koKWDviv7SlNb9CXlMd4BAAAAAP////9a72o7znYklRrluejAkI6P90ch7t96CZTVvx78fe6CgQIAAAAA/////6kt1klSeJ79FESTjpzlsQbnKACJxNxKeLPafHoradk/AwAAAAD//////Pcse7iIGUWVXkj1TmCBtRkBg2SE5cSKmSUGECnEBdEEAAAAAP////+gvhpNmiLIMtLSCjoITwENCamrQfs+Le29RusBBFePuQUAAAAA/////3GhQb9bZT4sQ3czBdaajJh2lERwyh4p5LA6CVPEvraVAQAAAAD/////PEJ8leyO15eW8T031SX76GhUXNkaHrDYn/kJgHMfOosHAAAAAP////8DgPD6AgAAAAAWABSzIr3c5jO4UaxzcKtFTws2egZU5YDw+gIAAAAAFgAUyrjFOm6PwCltHNORWjB9UcSRpVXykZgAAAAAABYAFCtuFro44oBQD4CyxXBu8C841ZCBAAAAAAABAR+AlpgAAAAAABYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgICVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv5HMEQCIBbWviRmE9jyCpj3llG6ZAI1JHi94AW6KSre5AwwYPl6AiBh5eJkvpqJL0V5vLzVxmBAXTuVrbgHyLVMrz3CL3X5/QEiBgJWUkhGCzwYbezxPbBvByT9ULR8w+SJwwB2yDY9UDjO/hgqcEdgLAAAgAAAAIAAAACAAQAAAAEAAAAAAQEfgJaYAAAAAAAWABSL8J1gt+NPNIJ9jbyxx2OQqRbKgiICAidEz7JDbhVgQOwcj+hC2e+aGMtArUHzEnJTkMNfe9NrRzBEAiBiIncJTyknBN+82VyVG5X4P4roWwWE0KYFhUinoK6BTgIgC5E6w/zOl4CRHpJ5l0Qq+N4JRfA6lXaiwwC96+CMYYIBIgYCJ0TPskNuFWBA7ByP6ELZ75oYy0CtQfMSclOQw19702sYKnBHYCwAAIAAAACAAAAAgAEAAAACAAAAAAEBH4CWmAAAAAAAFgAU8dPuZ4KSJeuJLMqwHiL2p3fn4h4iAgLn6Nwjb6AkNpQI0s5NhQgEgmGrwpe4EWBNoIetcdE4VUcwRAIgLcMUbZRKwSTmlkcwUk5zs2AM6E7EwobLzM/n6yXPsqMCIHAWYRFqF5ziE8FCgAcyU8NGfvjopzJGGKwmPjNwRrOmASIGAufo3CNvoCQ2lAjSzk2FCASCYavCl7gRYE2gh61x0ThVGCpwR2AsAACAAAAAgAAAAIABAAAAAwAAAAABAR+AlpgAAAAAABYAFBnWX4MosiBtmXB4VmDsDTSAj7B1IgIDPYdL8ZtpfPbGOWWVR6WDuGcwFkpbbbAb8goU65tq20RHMEQCIGK3Va0fEc0AG7l0R4jE24fZAlPTN/NwSMspUp6s2FQFAiBIO7xBB3x6McuvfcAqytBeKOQtKjIkyZz7MQZPohAVsAEiBgM9h0vxm2l89sY5ZZVHpYO4ZzAWSlttsBvyChTrm2rbRBgqcEdgLAAAgAAAAIAAAACAAQAAAAQAAAAAAQEfgJaYAAAAAAAWABQSt5VKde/Cog6G4y3C14ZH1nAHeSICAvsGFzDb3jyAa0oXqZ9FTIEoKuzubUb0qXWpTN/ToGUERzBEAiBl71BmnLeASoN7Eccn+KSJHeO0CFRMW4F/7UGzos29ZwIgRrOAs3PCNo/9znOpsrD2NO+DkVrqnmdxM8rq6GGiT4gBIgYC+wYXMNvePIBrShepn0VMgSgq7O5tRvSpdalM39OgZQQYKnBHYCwAAIAAAACAAAAAgAEAAAAFAAAAAAEBH4Dw+gIAAAAAFgAUl4qQRg5EZxpS9JoJu1nMZ5S2PIkiAgPj0kSjln4Lh3Zf2obF/ziIX3SZOVO5WEOIrvMLJq9q7EcwRAIgd5Ug2usK5Ycn3yV4VDzjKgYO107KhsRIIOUqzsQwE9ECIAl7CBVQYmK/lygnbbOqIng0lZGHRV3D8ZH5/oCqMJVSASIGA+PSRKOWfguHdl/ahsX/OIhfdJk5U7lYQ4iu8wsmr2rsGJ1rbYYsAACAAAAAgAAAAIABAAAAAQAAAAABAR+AlpgAAAAAABYAFBzoeOOg2js0MIeX/ey3YiH4VBivIgIDwCMlwyj+1iKp2I+PUxjgUmGjw6lntyEdfWdlfiten75HMEQCIA/QJJEMYgfSZ5rRubsO2MD/jVWqYD73xJmRfaIKP0F6AiAIbfoMzocTheJNqQt+IPXx4fn31wfFVivPpmqFXX0iCAEiBgPAIyXDKP7WIqnYj49TGOBSYaPDqWe3IR19Z2V+K16fvhgqcEdgLAAAgAAAAIAAAACAAQAAAAcAAAAAIgIDRzv8jHcMGyIKLnquS632wNfq8pAo1bKdNDgBK7KJ74EYKnBHYCwAAIAAAACAAAAAgAAAAAACAAAAACICA2R0r/JjPDUYZVOftStiudb7nk4jV2Yo4fCgp5k0WOBsGJ1rbYYsAACAAAAAgAAAAIAAAAAAAgAAAAAiAgL38NfQAom3xaWBvDUnYEDDSN5I/EFAZ/MeomrZXABVDBgqcEdgLAAAgAAAAIAAAACAAQAAAGQAAAAA", psbt.GetBase64().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  // Input Finalizer
  try {
    EXPECT_FALSE(psbt.IsFinalized());
    OutPoint outpoint1(utxo_list1[0].txid, utxo_list1[0].vout);
    EXPECT_FALSE(psbt.IsFinalizedInput(outpoint1));
    psbt.Finalize();
    EXPECT_TRUE(psbt.IsFinalizedInput(outpoint1));
    EXPECT_STREQ("70736274ff0100fd86010200000007f834da7cb5e183fc815f7846227284660fa4a0a583be2bfb4a535bf425e531de0100000000ffffffff5aef6a3bce7624951ae5b9e8c0908e8ff74721eedf7a0994d5bf1efc7dee82810200000000ffffffffa92dd64952789efd1444938e9ce5b106e7280089c4dc4a78b3da7c7a2b69d93f0300000000fffffffffcf72c7bb8881945955e48f54e6081b51901836484e5c48a9925061029c405d10400000000ffffffffa0be1a4d9a22c832d2d20a3a084f010d09a9ab41fb3e2dedbd46eb0104578fb90500000000ffffffff71a141bf5b653e2c43773305d69a8c9876944470ca1e29e4b03a0953c4beb6950100000000ffffffff3c427c95ec8ed79796f13d37d525fbe868545cd91a1eb0d89ff90980731f3a8b0700000000ffffffff0380f0fa0200000000160014b322bddce633b851ac7370ab454f0b367a0654e580f0fa0200000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a555f2919800000000001600142b6e16ba38e280500f80b2c5706ef02f38d59081000000000001011f8096980000000000160014962c4e08f336d3afbc3415c9d359ae104047052001086b02473044022016d6be246613d8f20a98f79651ba6402352478bde005ba292adee40c3060f97a022061e5e264be9a892f4579bcbcd5c660405d3b95adb807c8b54caf3dc22f75f9fd012102565248460b3c186decf13db06f0724fd50b47cc3e489c30076c8363d5038cefe0001011f80969800000000001600148bf09d60b7e34f34827d8dbcb1c76390a916ca8201086b024730440220622277094f292704dfbcd95c951b95f83f8ae85b0584d0a6058548a7a0ae814e02200b913ac3fcce9780911e927997442af8de0945f03a9576a2c300bdebe08c61820121022744cfb2436e156040ec1c8fe842d9ef9a18cb40ad41f312725390c35f7bd36b0001011f8096980000000000160014f1d3ee67829225eb892ccab01e22f6a777e7e21e01086b0247304402202dc3146d944ac124e6964730524e73b3600ce84ec4c286cbcccfe7eb25cfb2a30220701661116a179ce213c14280073253c3467ef8e8a7324618ac263e337046b3a6012102e7e8dc236fa024369408d2ce4d8508048261abc297b811604da087ad71d138550001011f809698000000000016001419d65f8328b2206d9970785660ec0d34808fb07501086b02473044022062b755ad1f11cd001bb9744788c4db87d90253d337f37048cb29529eacd854050220483bbc41077c7a31cbaf7dc02acad05e28e42d2a3224c99cfb31064fa21015b00121033d874bf19b697cf6c639659547a583b86730164a5b6db01bf20a14eb9b6adb440001011f809698000000000016001412b7954a75efc2a20e86e32dc2d78647d670077901086b02473044022065ef50669cb7804a837b11c727f8a4891de3b408544c5b817fed41b3a2cdbd67022046b380b373c2368ffdce73a9b2b0f634ef83915aea9e677133caeae861a24f88012102fb061730dbde3c806b4a17a99f454c81282aecee6d46f4a975a94cdfd3a065040001011f80f0fa0200000000160014978a90460e44671a52f49a09bb59cc6794b63c8901086b024730440220779520daeb0ae58727df2578543ce32a060ed74eca86c44820e52acec43013d10220097b0815506262bf9728276db3aa227834959187455dc3f191f9fe80aa309552012103e3d244a3967e0b87765fda86c5ff38885f74993953b9584388aef30b26af6aec0001011f80969800000000001600141ce878e3a0da3b34308797fdecb76221f85418af01086b0247304402200fd024910c6207d2679ad1b9bb0ed8c0ff8d55aa603ef7c499917da20a3f417a0220086dfa0cce871385e24da90b7e20f5f1e1f9f7d707c5562bcfa66a855d7d2208012103c02325c328fed622a9d88f8f5318e05261a3c3a967b7211d7d67657e2b5e9fbe00220203473bfc8c770c1b220a2e7aae4badf6c0d7eaf29028d5b29d3438012bb289ef81182a7047602c00008000000080000000800000000002000000002202036474aff2633c351865539fb52b62b9d6fb9e4e23576628e1f0a0a7993458e06c189d6b6d862c0000800000008000000080000000000200000000220202f7f0d7d00289b7c5a581bc35276040c348de48fc414067f31ea26ad95c00550c182a7047602c0000800000008000000080010000006400000000", psbt.GetData().GetHex().c_str());

    psbt.Verify();
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  // Transaction Extractor
  try {
    EXPECT_TRUE(psbt.IsFinalized());
    EXPECT_EQ(psbt.GetFeeAmount().GetSatoshiValue(), 1166);
    auto tx = psbt.ExtractTransaction();
    EXPECT_STREQ("02000000000107f834da7cb5e183fc815f7846227284660fa4a0a583be2bfb4a535bf425e531de0100000000ffffffff5aef6a3bce7624951ae5b9e8c0908e8ff74721eedf7a0994d5bf1efc7dee82810200000000ffffffffa92dd64952789efd1444938e9ce5b106e7280089c4dc4a78b3da7c7a2b69d93f0300000000fffffffffcf72c7bb8881945955e48f54e6081b51901836484e5c48a9925061029c405d10400000000ffffffffa0be1a4d9a22c832d2d20a3a084f010d09a9ab41fb3e2dedbd46eb0104578fb90500000000ffffffff71a141bf5b653e2c43773305d69a8c9876944470ca1e29e4b03a0953c4beb6950100000000ffffffff3c427c95ec8ed79796f13d37d525fbe868545cd91a1eb0d89ff90980731f3a8b0700000000ffffffff0380f0fa0200000000160014b322bddce633b851ac7370ab454f0b367a0654e580f0fa0200000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a555f2919800000000001600142b6e16ba38e280500f80b2c5706ef02f38d5908102473044022016d6be246613d8f20a98f79651ba6402352478bde005ba292adee40c3060f97a022061e5e264be9a892f4579bcbcd5c660405d3b95adb807c8b54caf3dc22f75f9fd012102565248460b3c186decf13db06f0724fd50b47cc3e489c30076c8363d5038cefe024730440220622277094f292704dfbcd95c951b95f83f8ae85b0584d0a6058548a7a0ae814e02200b913ac3fcce9780911e927997442af8de0945f03a9576a2c300bdebe08c61820121022744cfb2436e156040ec1c8fe842d9ef9a18cb40ad41f312725390c35f7bd36b0247304402202dc3146d944ac124e6964730524e73b3600ce84ec4c286cbcccfe7eb25cfb2a30220701661116a179ce213c14280073253c3467ef8e8a7324618ac263e337046b3a6012102e7e8dc236fa024369408d2ce4d8508048261abc297b811604da087ad71d1385502473044022062b755ad1f11cd001bb9744788c4db87d90253d337f37048cb29529eacd854050220483bbc41077c7a31cbaf7dc02acad05e28e42d2a3224c99cfb31064fa21015b00121033d874bf19b697cf6c639659547a583b86730164a5b6db01bf20a14eb9b6adb4402473044022065ef50669cb7804a837b11c727f8a4891de3b408544c5b817fed41b3a2cdbd67022046b380b373c2368ffdce73a9b2b0f634ef83915aea9e677133caeae861a24f88012102fb061730dbde3c806b4a17a99f454c81282aecee6d46f4a975a94cdfd3a06504024730440220779520daeb0ae58727df2578543ce32a060ed74eca86c44820e52acec43013d10220097b0815506262bf9728276db3aa227834959187455dc3f191f9fe80aa309552012103e3d244a3967e0b87765fda86c5ff38885f74993953b9584388aef30b26af6aec0247304402200fd024910c6207d2679ad1b9bb0ed8c0ff8d55aa603ef7c499917da20a3f417a0220086dfa0cce871385e24da90b7e20f5f1e1f9f7d707c5562bcfa66a855d7d2208012103c02325c328fed622a9d88f8f5318e05261a3c3a967b7211d7d67657e2b5e9fbe00000000", tx.GetHex().c_str());

    TransactionContext context(tx.GetHex());
    auto utxos = psbt.GetUtxoDataAll();
    EXPECT_EQ(10000000, utxos[0].amount.GetSatoshiValue());
    EXPECT_EQ(10000000, utxos[4].amount.GetSatoshiValue());
    EXPECT_STREQ("b98f570401eb46bded2d3efb41aba9090d014f083a0ad2d232c8229a4d1abea0", utxos[4].txid.GetHex().c_str());
    UtxoData utxo0 = utxos[0];
    UtxoData utxo4 = utxos[4];
    UtxoData utxo5 = utxos[5];
    context.CollectInputUtxo(utxos);
    context.Verify();

    auto sighash = context.GetSignatureHash(0, ByteData("76a914962c4e08f336d3afbc3415c9d359ae104047052088ac"), SigHashType(),
        utxos[0].amount, WitnessVersion::kVersion0);
    EXPECT_STREQ(
      "b330738168b0df580797fa0e5eba6287b16f7b881df208c7045008f0d193e2c1",
      sighash.GetHex().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }
}